

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  uint uVar79;
  uint uVar80;
  long lVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  undefined4 uVar85;
  undefined8 unaff_R13;
  ulong uVar86;
  bool bVar87;
  float fVar88;
  undefined8 uVar89;
  vint4 bi_2;
  undefined1 auVar90 [16];
  float fVar123;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar94 [16];
  undefined1 auVar119 [32];
  undefined1 auVar100 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar142 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  float fVar160;
  vint4 ai_2;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar181;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar180 [64];
  vint4 ai;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar213;
  float fVar214;
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar215;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar219;
  float fVar227;
  float fVar228;
  vint4 ai_1;
  float fVar229;
  undefined1 auVar222 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar226 [64];
  undefined1 auVar233 [16];
  undefined1 auVar237 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [64];
  float fVar239;
  float fVar243;
  float fVar244;
  undefined1 auVar240 [16];
  float fVar245;
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [28];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [32];
  undefined1 auVar256 [16];
  undefined1 auVar259 [32];
  undefined1 auVar257 [16];
  undefined1 auVar260 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float s;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c24;
  uint uStack_b84;
  float local_b40;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8a8;
  ulong local_8a0;
  undefined1 auStack_898 [24];
  undefined1 local_880 [16];
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined4 uStack_7e4;
  undefined1 local_7e0 [32];
  uint local_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  uint local_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined8 local_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  uint uStack_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar143 [64];
  undefined1 auVar261 [64];
  undefined1 auVar269 [64];
  float fVar294;
  
  PVar1 = prim[1];
  uVar86 = (ulong)(byte)PVar1;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar88 = *(float *)(prim + uVar86 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar86 * 0x19 + 6));
  auVar90._0_4_ = fVar88 * auVar5._0_4_;
  auVar90._4_4_ = fVar88 * auVar5._4_4_;
  auVar90._8_4_ = fVar88 * auVar5._8_4_;
  auVar90._12_4_ = fVar88 * auVar5._12_4_;
  auVar196._0_4_ = fVar88 * auVar6._0_4_;
  auVar196._4_4_ = fVar88 * auVar6._4_4_;
  auVar196._8_4_ = fVar88 * auVar6._8_4_;
  auVar196._12_4_ = fVar88 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xc + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xd + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x12 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x13 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x14 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar273._4_4_ = auVar196._0_4_;
  auVar273._0_4_ = auVar196._0_4_;
  auVar273._8_4_ = auVar196._0_4_;
  auVar273._12_4_ = auVar196._0_4_;
  auVar125 = vshufps_avx(auVar196,auVar196,0x55);
  auVar91 = vshufps_avx(auVar196,auVar196,0xaa);
  fVar88 = auVar91._0_4_;
  auVar254._0_4_ = fVar88 * auVar7._0_4_;
  fVar123 = auVar91._4_4_;
  auVar254._4_4_ = fVar123 * auVar7._4_4_;
  fVar195 = auVar91._8_4_;
  auVar254._8_4_ = fVar195 * auVar7._8_4_;
  fVar213 = auVar91._12_4_;
  auVar254._12_4_ = fVar213 * auVar7._12_4_;
  auVar246._0_4_ = auVar10._0_4_ * fVar88;
  auVar246._4_4_ = auVar10._4_4_ * fVar123;
  auVar246._8_4_ = auVar10._8_4_ * fVar195;
  auVar246._12_4_ = auVar10._12_4_ * fVar213;
  auVar233._0_4_ = auVar144._0_4_ * fVar88;
  auVar233._4_4_ = auVar144._4_4_ * fVar123;
  auVar233._8_4_ = auVar144._8_4_ * fVar195;
  auVar233._12_4_ = auVar144._12_4_ * fVar213;
  auVar91 = vfmadd231ps_fma(auVar254,auVar125,auVar6);
  auVar96 = vfmadd231ps_fma(auVar246,auVar125,auVar9);
  auVar125 = vfmadd231ps_fma(auVar233,auVar92,auVar125);
  auVar161 = vfmadd231ps_fma(auVar91,auVar273,auVar5);
  auVar96 = vfmadd231ps_fma(auVar96,auVar273,auVar8);
  auVar186 = vfmadd231ps_fma(auVar125,auVar93,auVar273);
  auVar274._4_4_ = auVar90._0_4_;
  auVar274._0_4_ = auVar90._0_4_;
  auVar274._8_4_ = auVar90._0_4_;
  auVar274._12_4_ = auVar90._0_4_;
  auVar125 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar88 = auVar91._0_4_;
  auVar197._0_4_ = fVar88 * auVar7._0_4_;
  fVar123 = auVar91._4_4_;
  auVar197._4_4_ = fVar123 * auVar7._4_4_;
  fVar195 = auVar91._8_4_;
  auVar197._8_4_ = fVar195 * auVar7._8_4_;
  fVar213 = auVar91._12_4_;
  auVar197._12_4_ = fVar213 * auVar7._12_4_;
  auVar124._0_4_ = auVar10._0_4_ * fVar88;
  auVar124._4_4_ = auVar10._4_4_ * fVar123;
  auVar124._8_4_ = auVar10._8_4_ * fVar195;
  auVar124._12_4_ = auVar10._12_4_ * fVar213;
  auVar91._0_4_ = auVar144._0_4_ * fVar88;
  auVar91._4_4_ = auVar144._4_4_ * fVar123;
  auVar91._8_4_ = auVar144._8_4_ * fVar195;
  auVar91._12_4_ = auVar144._12_4_ * fVar213;
  auVar6 = vfmadd231ps_fma(auVar197,auVar125,auVar6);
  auVar7 = vfmadd231ps_fma(auVar124,auVar125,auVar9);
  auVar9 = vfmadd231ps_fma(auVar91,auVar125,auVar92);
  auVar10 = vfmadd231ps_fma(auVar6,auVar274,auVar5);
  auVar92 = vfmadd231ps_fma(auVar7,auVar274,auVar8);
  auVar144 = vfmadd231ps_fma(auVar9,auVar274,auVar93);
  auVar240._8_4_ = 0x7fffffff;
  auVar240._0_8_ = 0x7fffffff7fffffff;
  auVar240._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar161,auVar240);
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar185,1);
  auVar6 = vblendvps_avx(auVar161,auVar185,auVar5);
  auVar5 = vandps_avx(auVar96,auVar240);
  auVar5 = vcmpps_avx(auVar5,auVar185,1);
  auVar7 = vblendvps_avx(auVar96,auVar185,auVar5);
  auVar5 = vandps_avx(auVar240,auVar186);
  auVar5 = vcmpps_avx(auVar5,auVar185,1);
  auVar5 = vblendvps_avx(auVar186,auVar185,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = 0x3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar234);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar234);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar234);
  auVar93 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar186._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar186._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar186._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar186._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar198._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar198._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar198._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar198._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar86 * 0xe + 6);
  auVar5 = vpmovsxwd_avx(auVar7);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar92);
  auVar220._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar220._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar220._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar220._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar96._1_3_ = 0;
  auVar96[0] = PVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar92);
  auVar125._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar125._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar125._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar125._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar86 * 0x15 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar144);
  auVar161._0_4_ = auVar93._0_4_ * auVar5._0_4_;
  auVar161._4_4_ = auVar93._4_4_ * auVar5._4_4_;
  auVar161._8_4_ = auVar93._8_4_ * auVar5._8_4_;
  auVar161._12_4_ = auVar93._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar144);
  auVar92._0_4_ = auVar93._0_4_ * auVar5._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar5._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar5._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar186,auVar198);
  auVar6 = vpminsd_avx(auVar220,auVar125);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar161,auVar92);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar247._4_4_ = uVar85;
  auVar247._0_4_ = uVar85;
  auVar247._8_4_ = uVar85;
  auVar247._12_4_ = uVar85;
  auVar6 = vmaxps_avx(auVar6,auVar247);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_640._0_4_ = auVar5._0_4_ * 0.99999964;
  local_640._4_4_ = auVar5._4_4_ * 0.99999964;
  local_640._8_4_ = auVar5._8_4_ * 0.99999964;
  local_640._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar186,auVar198);
  auVar6 = vpmaxsd_avx(auVar220,auVar125);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar161,auVar92);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar144._4_4_ = uVar85;
  auVar144._0_4_ = uVar85;
  auVar144._8_4_ = uVar85;
  auVar144._12_4_ = uVar85;
  auVar6 = vminps_avx(auVar6,auVar144);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar93._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar96[4] = PVar1;
  auVar96._5_3_ = 0;
  auVar96[8] = PVar1;
  auVar96._9_3_ = 0;
  auVar96[0xc] = PVar1;
  auVar96._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar96,_DAT_01f4ad30);
  auVar5 = vcmpps_avx(local_640,auVar93,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar85 = vmovmskps_avx(auVar5);
  uVar86 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar85);
  auVar107._16_16_ = mm_lookupmask_ps._240_16_;
  auVar107._0_16_ = mm_lookupmask_ps._240_16_;
  local_600 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8a8 = prim;
LAB_01167d3c:
  if (uVar86 == 0) {
    return;
  }
  lVar81 = 0;
  for (uVar83 = uVar86; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  uVar80 = *(uint *)(local_8a8 + 2);
  local_7c0 = *(uint *)(local_8a8 + lVar81 * 4 + 6);
  local_8a0 = (ulong)local_7c0;
  pGVar3 = (context->scene->geometries).items[uVar80].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8a0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar81 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar81 + (long)p_Var4 * uVar83);
  auVar6 = *(undefined1 (*) [16])(lVar81 + (uVar83 + 1) * (long)p_Var4);
  uVar86 = uVar86 - 1 & uVar86;
  if (uVar86 != 0) {
    uVar84 = uVar86 - 1 & uVar86;
    for (uVar16 = uVar86; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
    }
    if (uVar84 != 0) {
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar255._4_4_ = uVar85;
  auVar255._0_4_ = uVar85;
  auVar255._8_4_ = uVar85;
  auVar255._12_4_ = uVar85;
  fStack_6d0 = (float)uVar85;
  _local_6e0 = auVar255;
  fStack_6cc = (float)uVar85;
  fStack_6c8 = (float)uVar85;
  register0x0000149c = uVar85;
  auVar261 = ZEXT3264(_local_6e0);
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar263._4_4_ = uVar85;
  auVar263._0_4_ = uVar85;
  auVar263._8_4_ = uVar85;
  auVar263._12_4_ = uVar85;
  fStack_7f0 = (float)uVar85;
  _local_800 = auVar263;
  fStack_7ec = (float)uVar85;
  fStack_7e8 = (float)uVar85;
  uStack_7e4 = uVar85;
  auVar7 = vunpcklps_avx(auVar255,auVar263);
  fVar88 = *(float *)(ray + k * 4 + 0x60);
  auVar266._4_4_ = fVar88;
  auVar266._0_4_ = fVar88;
  auVar266._8_4_ = fVar88;
  auVar266._12_4_ = fVar88;
  fStack_810 = fVar88;
  _local_820 = auVar266;
  fStack_80c = fVar88;
  fStack_808 = fVar88;
  uStack_804 = fVar88;
  auVar269 = ZEXT3264(_local_820);
  local_9f0 = vinsertps_avx(auVar7,auVar266,0x28);
  auVar242 = ZEXT1664(local_9f0);
  auVar199._0_4_ = (auVar5._0_4_ + auVar6._0_4_) * 0.5;
  auVar199._4_4_ = (auVar5._4_4_ + auVar6._4_4_) * 0.5;
  auVar199._8_4_ = (auVar5._8_4_ + auVar6._8_4_) * 0.5;
  auVar199._12_4_ = (auVar5._12_4_ + auVar6._12_4_) * 0.5;
  auVar7 = vsubps_avx(auVar199,auVar8);
  auVar7 = vdpps_avx(auVar7,local_9f0,0x7f);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar9 = vrcpss_avx(local_a00,local_a00);
  auVar10 = vfnmadd213ss_fma(auVar9,local_a00,ZEXT416(0x40000000));
  local_360 = auVar7._0_4_ * auVar9._0_4_ * auVar10._0_4_;
  auVar221._4_4_ = local_360;
  auVar221._0_4_ = local_360;
  auVar221._8_4_ = local_360;
  auVar221._12_4_ = local_360;
  fStack_990 = local_360;
  _local_9a0 = auVar221;
  fStack_98c = local_360;
  fStack_988 = local_360;
  fStack_984 = local_360;
  auVar7 = vfmadd231ps_fma(auVar8,local_9f0,auVar221);
  auVar7 = vblendps_avx(auVar7,_DAT_01f45a50,8);
  auVar8 = vsubps_avx(auVar5,auVar7);
  auVar226 = ZEXT1664(auVar8);
  auVar9 = vsubps_avx(*(undefined1 (*) [16])(lVar81 + (uVar83 + 2) * (long)p_Var4),auVar7);
  auVar10 = vsubps_avx(auVar6,auVar7);
  auVar7 = vsubps_avx(*(undefined1 (*) [16])(lVar81 + (uVar83 + 3) * (long)p_Var4),auVar7);
  auVar180 = ZEXT1664(auVar7);
  auVar5 = vmovshdup_avx(auVar8);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vmovshdup_avx(auVar10);
  local_480 = auVar5._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_4a0 = auVar5._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_4c0 = auVar5._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar5 = vmovshdup_avx(auVar9);
  local_4e0 = auVar5._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_500 = auVar5._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_520 = auVar5._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar5 = vmovshdup_avx(auVar7);
  uVar89 = auVar5._0_8_;
  local_5e0._8_8_ = uVar89;
  local_5e0._0_8_ = uVar89;
  local_5e0._16_8_ = uVar89;
  local_5e0._24_8_ = uVar89;
  auVar5 = vshufps_avx(auVar7,auVar7,0xaa);
  local_540 = auVar5._0_8_;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  auVar5 = vshufps_avx(auVar7,auVar7,0xff);
  local_560 = auVar5._0_8_;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar88 * fVar88)),_local_800,_local_800);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_6e0,_local_6e0);
  uVar85 = auVar5._0_4_;
  local_240._4_4_ = uVar85;
  local_240._0_4_ = uVar85;
  local_240._8_4_ = uVar85;
  local_240._12_4_ = uVar85;
  local_240._16_4_ = uVar85;
  local_240._20_4_ = uVar85;
  local_240._24_4_ = uVar85;
  local_240._28_4_ = uVar85;
  auVar238 = ZEXT3264(local_240);
  fVar88 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)local_360);
  local_360 = fVar88 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar83 = 0;
  local_c24 = 1;
  local_580 = auVar8._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  local_5a0 = auVar10._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  local_5c0 = auVar9._0_4_;
  uStack_5bc = local_5c0;
  uStack_5b8 = local_5c0;
  uStack_5b4 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5ac = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_5a4 = local_5c0;
  fVar123 = auVar7._0_4_;
  local_700._8_4_ = 0x7fffffff;
  local_700._0_8_ = 0x7fffffff7fffffff;
  local_700._12_4_ = 0x7fffffff;
  local_700._16_4_ = 0x7fffffff;
  local_700._20_4_ = 0x7fffffff;
  local_700._24_4_ = 0x7fffffff;
  local_700._28_4_ = 0x7fffffff;
  local_620 = vandps_avx(local_240,local_700);
  auVar5 = vsqrtss_avx(local_a00,local_a00);
  auVar6 = vsqrtss_avx(local_a00,local_a00);
  local_630 = ZEXT816(0x3f80000000000000);
  local_340 = fVar123;
  fStack_33c = fVar123;
  fStack_338 = fVar123;
  fStack_334 = fVar123;
  fStack_330 = fVar123;
  fStack_32c = fVar123;
  fStack_328 = fVar123;
  fStack_324 = fVar123;
  uStack_7bc = local_7c0;
  uStack_7b8 = local_7c0;
  uStack_7b4 = local_7c0;
  local_7b0 = uVar80;
  uStack_7ac = uVar80;
  uStack_7a8 = uVar80;
  uStack_7a4 = uVar80;
  do {
    auVar93 = vmovshdup_avx(local_630);
    auVar93 = vsubps_avx(auVar93,local_630);
    auVar108._0_4_ = auVar93._0_4_;
    fVar160 = auVar108._0_4_ * 0.04761905;
    uVar85 = local_630._0_4_;
    auVar202._4_4_ = uVar85;
    auVar202._0_4_ = uVar85;
    auVar202._8_4_ = uVar85;
    auVar202._12_4_ = uVar85;
    auVar202._16_4_ = uVar85;
    auVar202._20_4_ = uVar85;
    auVar202._24_4_ = uVar85;
    auVar202._28_4_ = uVar85;
    auVar108._4_4_ = auVar108._0_4_;
    auVar108._8_4_ = auVar108._0_4_;
    auVar108._12_4_ = auVar108._0_4_;
    auVar108._16_4_ = auVar108._0_4_;
    auVar108._20_4_ = auVar108._0_4_;
    auVar108._24_4_ = auVar108._0_4_;
    auVar108._28_4_ = auVar108._0_4_;
    auVar93 = vfmadd231ps_fma(auVar202,auVar108,_DAT_01f7b040);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar109._16_4_ = 0x3f800000;
    auVar109._20_4_ = 0x3f800000;
    auVar109._24_4_ = 0x3f800000;
    auVar109._28_4_ = 0x3f800000;
    auVar107 = vsubps_avx(auVar109,ZEXT1632(auVar93));
    fVar195 = auVar93._0_4_;
    fVar214 = auVar93._4_4_;
    fVar216 = auVar93._8_4_;
    fVar218 = auVar93._12_4_;
    auVar180._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * fVar218,
                            CONCAT48(fVar216 * fVar216,CONCAT44(fVar214 * fVar214,fVar195 * fVar195)
                                    )));
    fVar239 = fVar195 * 3.0;
    fVar243 = fVar214 * 3.0;
    fVar244 = fVar216 * 3.0;
    fVar245 = fVar218 * 3.0;
    fVar213 = auVar107._0_4_;
    auVar262._0_4_ = fVar213 * fVar213;
    fVar215 = auVar107._4_4_;
    auVar262._4_4_ = fVar215 * fVar215;
    fVar217 = auVar107._8_4_;
    auVar262._8_4_ = fVar217 * fVar217;
    fVar181 = auVar107._12_4_;
    auVar262._12_4_ = fVar181 * fVar181;
    fVar182 = auVar107._16_4_;
    auVar262._16_4_ = fVar182 * fVar182;
    fVar183 = auVar107._20_4_;
    auVar262._20_4_ = fVar183 * fVar183;
    fVar184 = auVar107._24_4_;
    auVar262._28_36_ = auVar261._28_36_;
    auVar262._24_4_ = fVar184 * fVar184;
    auVar261._0_4_ = (auVar262._0_4_ * (fVar213 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar261._4_4_ = (auVar262._4_4_ * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar261._8_4_ = (auVar262._8_4_ * (fVar217 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar261._12_4_ = (auVar262._12_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar261._16_4_ = (auVar262._16_4_ * (fVar182 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar261._20_4_ = (auVar262._20_4_ * (fVar183 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar261._28_36_ = auVar269._28_36_;
    auVar261._24_4_ = (auVar262._24_4_ * (fVar184 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar116 = auVar261._0_32_;
    fVar219 = fVar195 * fVar195 * -fVar213 * 0.5;
    fVar227 = fVar214 * fVar214 * -fVar215 * 0.5;
    fVar228 = fVar216 * fVar216 * -fVar217 * 0.5;
    fVar229 = fVar218 * fVar218 * -fVar181 * 0.5;
    fVar230 = -fVar182 * 0.0 * 0.0 * 0.5;
    fVar231 = -fVar183 * 0.0 * 0.0 * 0.5;
    fVar232 = -fVar184 * 0.0 * 0.0 * 0.5;
    auVar118._4_4_ = fStack_33c * fVar227;
    auVar118._0_4_ = local_340 * fVar219;
    auVar118._8_4_ = fStack_338 * fVar228;
    auVar118._12_4_ = fStack_334 * fVar229;
    auVar118._16_4_ = fStack_330 * fVar230;
    auVar118._20_4_ = fStack_32c * fVar231;
    auVar118._24_4_ = fStack_328 * fVar232;
    auVar118._28_4_ = auVar238._28_4_ + -5.0 + 2.0;
    auVar279._4_4_ = local_5e0._4_4_ * fVar227;
    auVar279._0_4_ = local_5e0._0_4_ * fVar219;
    auVar279._8_4_ = local_5e0._8_4_ * fVar228;
    auVar279._12_4_ = local_5e0._12_4_ * fVar229;
    auVar279._16_4_ = local_5e0._16_4_ * fVar230;
    auVar279._20_4_ = local_5e0._20_4_ * fVar231;
    auVar279._24_4_ = local_5e0._24_4_ * fVar232;
    auVar279._28_4_ = local_5e0._28_4_;
    auVar12._4_4_ = fVar227 * local_540._4_4_;
    auVar12._0_4_ = fVar219 * (float)local_540;
    auVar12._8_4_ = fVar228 * (float)uStack_538;
    auVar12._12_4_ = fVar229 * uStack_538._4_4_;
    auVar12._16_4_ = fVar230 * (float)uStack_530;
    auVar12._20_4_ = fVar231 * uStack_530._4_4_;
    auVar12._24_4_ = fVar232 * (float)uStack_528;
    auVar12._28_4_ = auVar107._28_4_ ^ 0x80000000;
    auVar210._4_4_ = fVar227 * local_560._4_4_;
    auVar210._0_4_ = fVar219 * (float)local_560;
    auVar210._8_4_ = fVar228 * (float)uStack_558;
    auVar210._12_4_ = fVar229 * uStack_558._4_4_;
    auVar210._16_4_ = fVar230 * (float)uStack_550;
    auVar210._20_4_ = fVar231 * uStack_550._4_4_;
    auVar210._24_4_ = fVar232 * (float)uStack_548;
    auVar210._28_4_ = auVar226._28_4_;
    auVar222._4_4_ = uStack_5bc;
    auVar222._0_4_ = local_5c0;
    auVar222._8_4_ = uStack_5b8;
    auVar222._12_4_ = uStack_5b4;
    auVar222._16_4_ = uStack_5b0;
    auVar222._20_4_ = uStack_5ac;
    auVar222._24_4_ = uStack_5a8;
    auVar222._28_4_ = uStack_5a4;
    auVar93 = vfmadd231ps_fma(auVar118,auVar116,auVar222);
    auVar64._8_8_ = uStack_4d8;
    auVar64._0_8_ = local_4e0;
    auVar64._16_8_ = uStack_4d0;
    auVar64._24_8_ = uStack_4c8;
    auVar92 = vfmadd231ps_fma(auVar279,auVar116,auVar64);
    auVar62._8_8_ = uStack_4f8;
    auVar62._0_8_ = local_500;
    auVar62._16_8_ = uStack_4f0;
    auVar62._24_8_ = uStack_4e8;
    auVar144 = vfmadd231ps_fma(auVar12,auVar116,auVar62);
    auVar60._8_8_ = uStack_518;
    auVar60._0_8_ = local_520;
    auVar60._16_8_ = uStack_510;
    auVar60._24_8_ = uStack_508;
    auVar125 = vfmadd231ps_fma(auVar210,auVar116,auVar60);
    auVar116._4_4_ = ((fVar243 + -5.0) * fVar214 * fVar214 + 2.0) * 0.5;
    auVar116._0_4_ = ((fVar239 + -5.0) * fVar195 * fVar195 + 2.0) * 0.5;
    auVar116._8_4_ = ((fVar244 + -5.0) * fVar216 * fVar216 + 2.0) * 0.5;
    auVar116._12_4_ = ((fVar245 + -5.0) * fVar218 * fVar218 + 2.0) * 0.5;
    auVar116._16_4_ = 0x3f800000;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = auVar269._28_4_ + 2.0;
    auVar56._4_4_ = uStack_59c;
    auVar56._0_4_ = local_5a0;
    auVar56._8_4_ = uStack_598;
    auVar56._12_4_ = uStack_594;
    auVar56._16_4_ = uStack_590;
    auVar56._20_4_ = uStack_58c;
    auVar56._24_4_ = uStack_588;
    auVar56._28_4_ = uStack_584;
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar116,auVar56);
    auVar70._8_8_ = uStack_478;
    auVar70._0_8_ = local_480;
    auVar70._16_8_ = uStack_470;
    auVar70._24_8_ = uStack_468;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar116,auVar70);
    auVar68._8_8_ = uStack_498;
    auVar68._0_8_ = local_4a0;
    auVar68._16_8_ = uStack_490;
    auVar68._24_8_ = uStack_488;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar116,auVar68);
    auVar66._8_8_ = uStack_4b8;
    auVar66._0_8_ = local_4c0;
    auVar66._16_8_ = uStack_4b0;
    auVar66._24_8_ = uStack_4a8;
    auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar116,auVar66);
    local_880._8_4_ = 0x80000000;
    local_880._0_8_ = 0x8000000080000000;
    local_880._12_4_ = 0x80000000;
    uStack_870 = 0x80000000;
    uStack_86c = 0x80000000;
    uStack_868 = 0x80000000;
    uStack_864 = 0x80000000;
    auVar135._4_4_ = -fVar214 * fVar215 * fVar215 * 0.5;
    auVar135._0_4_ = -fVar195 * fVar213 * fVar213 * 0.5;
    auVar135._8_4_ = -fVar216 * fVar217 * fVar217 * 0.5;
    auVar135._12_4_ = -fVar218 * fVar181 * fVar181 * 0.5;
    auVar135._16_4_ = fVar182 * -0.0 * fVar182 * 0.5;
    auVar135._20_4_ = fVar183 * -0.0 * fVar183 * 0.5;
    auVar135._24_4_ = fVar184 * -0.0 * fVar184 * 0.5;
    auVar135._28_4_ = 0x80000000;
    auVar58._4_4_ = uStack_57c;
    auVar58._0_4_ = local_580;
    auVar58._8_4_ = uStack_578;
    auVar58._12_4_ = uStack_574;
    auVar58._16_4_ = uStack_570;
    auVar58._20_4_ = uStack_56c;
    auVar58._24_4_ = uStack_568;
    auVar58._28_4_ = uStack_564;
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar135,auVar58);
    auVar77._8_8_ = uStack_1d8;
    auVar77._0_8_ = local_1e0;
    auVar77._16_8_ = uStack_1d0;
    auVar77._24_8_ = uStack_1c8;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar135,auVar77);
    auVar76._8_8_ = uStack_1f8;
    auVar76._0_8_ = local_200;
    auVar76._16_8_ = uStack_1f0;
    auVar76._24_8_ = uStack_1e8;
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar135,auVar76);
    auVar75._8_8_ = uStack_218;
    auVar75._0_8_ = local_220;
    auVar75._16_8_ = uStack_210;
    auVar75._24_8_ = uStack_208;
    auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar75,auVar135);
    auVar222 = ZEXT1632(auVar125);
    auVar203._0_4_ = (fVar213 + fVar213) * fVar195;
    auVar203._4_4_ = (fVar215 + fVar215) * fVar214;
    auVar203._8_4_ = (fVar217 + fVar217) * fVar216;
    auVar203._12_4_ = (fVar181 + fVar181) * fVar218;
    auVar203._16_4_ = (fVar182 + fVar182) * 0.0;
    auVar203._20_4_ = (fVar183 + fVar183) * 0.0;
    auVar203._24_4_ = (fVar184 + fVar184) * 0.0;
    auVar203._28_4_ = 0;
    auVar118 = vsubps_avx(auVar203,auVar262._0_32_);
    fVar219 = auVar242._28_4_ + 2.0;
    auVar209._4_4_ = (fVar215 + fVar215) * (fVar243 + 2.0);
    auVar209._0_4_ = (fVar213 + fVar213) * (fVar239 + 2.0);
    auVar209._8_4_ = (fVar217 + fVar217) * (fVar244 + 2.0);
    auVar209._12_4_ = (fVar181 + fVar181) * (fVar245 + 2.0);
    auVar209._16_4_ = (fVar182 + fVar182) * 2.0;
    auVar209._20_4_ = (fVar183 + fVar183) * 2.0;
    auVar209._24_4_ = (fVar184 + fVar184) * 2.0;
    auVar209._28_4_ = fVar219;
    auVar13._4_4_ = fVar215 * fVar215 * 3.0;
    auVar13._0_4_ = fVar213 * fVar213 * 3.0;
    auVar13._8_4_ = fVar217 * fVar217 * 3.0;
    auVar13._12_4_ = fVar181 * fVar181 * 3.0;
    auVar13._16_4_ = fVar182 * fVar182 * 3.0;
    auVar13._20_4_ = fVar183 * fVar183 * 3.0;
    auVar13._24_4_ = fVar184 * fVar184 * 3.0;
    auVar13._28_4_ = auVar107._28_4_;
    auVar107 = vsubps_avx(auVar209,auVar13);
    auVar279 = vsubps_avx(auVar180._0_32_,auVar203);
    auVar14._4_4_ = auVar118._4_4_ * 0.5;
    auVar14._0_4_ = auVar118._0_4_ * 0.5;
    auVar14._8_4_ = auVar118._8_4_ * 0.5;
    auVar14._12_4_ = auVar118._12_4_ * 0.5;
    auVar14._16_4_ = auVar118._16_4_ * 0.5;
    auVar14._20_4_ = auVar118._20_4_ * 0.5;
    auVar14._24_4_ = auVar118._24_4_ * 0.5;
    auVar14._28_4_ = auVar238._28_4_;
    auVar208._28_4_ = fVar219;
    auVar208._0_28_ =
         ZEXT1628(CONCAT412((fVar245 * fVar218 + (fVar218 + fVar218) * (fVar245 + -5.0)) * 0.5,
                            CONCAT48((fVar244 * fVar216 + (fVar216 + fVar216) * (fVar244 + -5.0)) *
                                     0.5,CONCAT44((fVar243 * fVar214 +
                                                  (fVar214 + fVar214) * (fVar243 + -5.0)) * 0.5,
                                                  (fVar239 * fVar195 +
                                                  (fVar195 + fVar195) * (fVar239 + -5.0)) * 0.5))));
    auVar267._4_4_ = auVar107._4_4_ * 0.5;
    auVar267._0_4_ = auVar107._0_4_ * 0.5;
    auVar267._8_4_ = auVar107._8_4_ * 0.5;
    auVar267._12_4_ = auVar107._12_4_ * 0.5;
    auVar267._16_4_ = auVar107._16_4_ * 0.5;
    auVar267._20_4_ = auVar107._20_4_ * 0.5;
    auVar267._24_4_ = auVar107._24_4_ * 0.5;
    auVar267._28_4_ = auVar107._28_4_;
    fVar195 = auVar279._0_4_ * 0.5;
    fVar213 = auVar279._4_4_ * 0.5;
    fVar214 = auVar279._8_4_ * 0.5;
    fVar215 = auVar279._12_4_ * 0.5;
    fVar216 = auVar279._16_4_ * 0.5;
    fVar217 = auVar279._20_4_ * 0.5;
    fVar218 = auVar279._24_4_ * 0.5;
    auVar275._4_4_ = fStack_33c * fVar213;
    auVar275._0_4_ = local_340 * fVar195;
    auVar275._8_4_ = fStack_338 * fVar214;
    auVar275._12_4_ = fStack_334 * fVar215;
    auVar275._16_4_ = fStack_330 * fVar216;
    auVar275._20_4_ = fStack_32c * fVar217;
    auVar275._24_4_ = fStack_328 * fVar218;
    auVar275._28_4_ = fStack_324;
    auVar11._4_4_ = fVar213 * local_5e0._4_4_;
    auVar11._0_4_ = fVar195 * local_5e0._0_4_;
    auVar11._8_4_ = fVar214 * local_5e0._8_4_;
    auVar11._12_4_ = fVar215 * local_5e0._12_4_;
    auVar11._16_4_ = fVar216 * local_5e0._16_4_;
    auVar11._20_4_ = fVar217 * local_5e0._20_4_;
    auVar11._24_4_ = fVar218 * local_5e0._24_4_;
    auVar11._28_4_ = auVar118._28_4_;
    auVar17._4_4_ = fVar213 * local_540._4_4_;
    auVar17._0_4_ = fVar195 * (float)local_540;
    auVar17._8_4_ = fVar214 * (float)uStack_538;
    auVar17._12_4_ = fVar215 * uStack_538._4_4_;
    auVar17._16_4_ = fVar216 * (float)uStack_530;
    auVar17._20_4_ = fVar217 * uStack_530._4_4_;
    auVar17._24_4_ = fVar218 * (float)uStack_528;
    auVar17._28_4_ = auVar242._28_4_ + -5.0 + 0.0;
    auVar18._4_4_ = fVar213 * local_560._4_4_;
    auVar18._0_4_ = fVar195 * (float)local_560;
    auVar18._8_4_ = fVar214 * (float)uStack_558;
    auVar18._12_4_ = fVar215 * uStack_558._4_4_;
    auVar18._16_4_ = fVar216 * (float)uStack_550;
    auVar18._20_4_ = fVar217 * uStack_550._4_4_;
    auVar18._24_4_ = fVar218 * (float)uStack_548;
    auVar18._28_4_ = auVar279._28_4_;
    auVar55._4_4_ = uStack_5bc;
    auVar55._0_4_ = local_5c0;
    auVar55._8_4_ = uStack_5b8;
    auVar55._12_4_ = uStack_5b4;
    auVar55._16_4_ = uStack_5b0;
    auVar55._20_4_ = uStack_5ac;
    auVar55._24_4_ = uStack_5a8;
    auVar55._28_4_ = uStack_5a4;
    auVar91 = vfmadd231ps_fma(auVar275,auVar267,auVar55);
    auVar65._8_8_ = uStack_4d8;
    auVar65._0_8_ = local_4e0;
    auVar65._16_8_ = uStack_4d0;
    auVar65._24_8_ = uStack_4c8;
    auVar96 = vfmadd231ps_fma(auVar11,auVar267,auVar65);
    auVar63._8_8_ = uStack_4f8;
    auVar63._0_8_ = local_500;
    auVar63._16_8_ = uStack_4f0;
    auVar63._24_8_ = uStack_4e8;
    auVar161 = vfmadd231ps_fma(auVar17,auVar267,auVar63);
    auVar61._8_8_ = uStack_518;
    auVar61._0_8_ = local_520;
    auVar61._16_8_ = uStack_510;
    auVar61._24_8_ = uStack_508;
    auVar186 = vfmadd231ps_fma(auVar18,auVar267,auVar61);
    auVar57._4_4_ = uStack_59c;
    auVar57._0_4_ = local_5a0;
    auVar57._8_4_ = uStack_598;
    auVar57._12_4_ = uStack_594;
    auVar57._16_4_ = uStack_590;
    auVar57._20_4_ = uStack_58c;
    auVar57._24_4_ = uStack_588;
    auVar57._28_4_ = uStack_584;
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar208,auVar57);
    auVar71._8_8_ = uStack_478;
    auVar71._0_8_ = local_480;
    auVar71._16_8_ = uStack_470;
    auVar71._24_8_ = uStack_468;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar208,auVar71);
    auVar69._8_8_ = uStack_498;
    auVar69._0_8_ = local_4a0;
    auVar69._16_8_ = uStack_490;
    auVar69._24_8_ = uStack_488;
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar208,auVar69);
    auVar67._8_8_ = uStack_4b8;
    auVar67._0_8_ = local_4c0;
    auVar67._16_8_ = uStack_4b0;
    auVar67._24_8_ = uStack_4a8;
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar208,auVar67);
    auVar59._4_4_ = uStack_57c;
    auVar59._0_4_ = local_580;
    auVar59._8_4_ = uStack_578;
    auVar59._12_4_ = uStack_574;
    auVar59._16_4_ = uStack_570;
    auVar59._20_4_ = uStack_56c;
    auVar59._24_4_ = uStack_568;
    auVar59._28_4_ = uStack_564;
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar14,auVar59);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar14,auVar77);
    auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar14,auVar76);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar75,auVar14);
    local_7e0._0_4_ = auVar91._0_4_ * fVar160;
    local_7e0._4_4_ = auVar91._4_4_ * fVar160;
    local_7e0._8_4_ = auVar91._8_4_ * fVar160;
    local_7e0._12_4_ = auVar91._12_4_ * fVar160;
    local_7e0._16_4_ = fVar160 * 0.0;
    local_7e0._20_4_ = fVar160 * 0.0;
    local_7e0._24_4_ = fVar160 * 0.0;
    local_7e0._28_4_ = 0;
    auVar258._0_4_ = auVar96._0_4_ * fVar160;
    auVar258._4_4_ = auVar96._4_4_ * fVar160;
    auVar258._8_4_ = auVar96._8_4_ * fVar160;
    auVar258._12_4_ = auVar96._12_4_ * fVar160;
    auVar258._16_4_ = fVar160 * 0.0;
    auVar258._20_4_ = fVar160 * 0.0;
    auVar258._24_4_ = fVar160 * 0.0;
    auVar258._28_4_ = 0;
    fVar272 = auVar161._0_4_ * fVar160;
    fVar280 = auVar161._4_4_ * fVar160;
    auVar19._4_4_ = fVar280;
    auVar19._0_4_ = fVar272;
    fVar281 = auVar161._8_4_ * fVar160;
    auVar19._8_4_ = fVar281;
    fVar282 = auVar161._12_4_ * fVar160;
    auVar19._12_4_ = fVar282;
    fVar283 = fVar160 * 0.0;
    auVar19._16_4_ = fVar283;
    fVar284 = fVar160 * 0.0;
    auVar19._20_4_ = fVar284;
    fVar286 = fVar160 * 0.0;
    auVar19._24_4_ = fVar286;
    auVar19._28_4_ = 0x3f000000;
    fVar213 = fVar160 * auVar186._0_4_;
    fVar215 = fVar160 * auVar186._4_4_;
    auVar20._4_4_ = fVar215;
    auVar20._0_4_ = fVar213;
    fVar217 = fVar160 * auVar186._8_4_;
    auVar20._8_4_ = fVar217;
    fVar181 = fVar160 * auVar186._12_4_;
    auVar20._12_4_ = fVar181;
    auVar20._16_4_ = fVar160 * 0.0;
    auVar20._20_4_ = fVar160 * 0.0;
    auVar20._24_4_ = fVar160 * 0.0;
    auVar20._28_4_ = fVar160;
    _local_960 = ZEXT1632(auVar93);
    auVar209 = vpermps_avx2(_DAT_01fb7720,_local_960);
    local_940 = ZEXT1632(auVar144);
    local_a80 = vpermps_avx2(_DAT_01fb7720,local_940);
    local_2e0 = vsubps_avx(auVar209,ZEXT1632(auVar93));
    local_2c0 = vsubps_avx(local_a80,ZEXT1632(auVar144));
    fVar195 = local_2c0._0_4_;
    auVar204._0_4_ = (float)local_7e0._0_4_ * fVar195;
    fVar214 = local_2c0._4_4_;
    auVar204._4_4_ = local_7e0._4_4_ * fVar214;
    fVar216 = local_2c0._8_4_;
    auVar204._8_4_ = local_7e0._8_4_ * fVar216;
    fVar218 = local_2c0._12_4_;
    auVar204._12_4_ = local_7e0._12_4_ * fVar218;
    fVar182 = local_2c0._16_4_;
    auVar204._16_4_ = local_7e0._16_4_ * fVar182;
    fVar183 = local_2c0._20_4_;
    auVar204._20_4_ = local_7e0._20_4_ * fVar183;
    fVar184 = local_2c0._24_4_;
    auVar204._24_4_ = local_7e0._24_4_ * fVar184;
    auVar204._28_4_ = 0;
    auVar93 = vfmsub231ps_fma(auVar204,auVar19,local_2e0);
    auVar13 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar92));
    local_300 = vsubps_avx(auVar13,ZEXT1632(auVar92));
    local_2a0 = ZEXT1632(auVar92);
    fVar244 = local_2e0._0_4_;
    fVar245 = local_2e0._4_4_;
    auVar21._4_4_ = fVar245 * auVar258._4_4_;
    auVar21._0_4_ = fVar244 * auVar258._0_4_;
    fVar294 = local_2e0._8_4_;
    auVar21._8_4_ = fVar294 * auVar258._8_4_;
    fVar285 = local_2e0._12_4_;
    auVar21._12_4_ = fVar285 * auVar258._12_4_;
    fVar287 = local_2e0._16_4_;
    auVar21._16_4_ = fVar287 * auVar258._16_4_;
    fVar270 = local_2e0._20_4_;
    auVar21._20_4_ = fVar270 * auVar258._20_4_;
    fVar271 = local_2e0._24_4_;
    auVar21._24_4_ = fVar271 * auVar258._24_4_;
    auVar21._28_4_ = auVar13._28_4_;
    auVar92 = vfmsub231ps_fma(auVar21,local_7e0,local_300);
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * auVar92._12_4_,
                                                 CONCAT48(auVar92._8_4_ * auVar92._8_4_,
                                                          CONCAT44(auVar92._4_4_ * auVar92._4_4_,
                                                                   auVar92._0_4_ * auVar92._0_4_))))
                              ,ZEXT1632(auVar93),ZEXT1632(auVar93));
    fVar228 = local_300._0_4_;
    auVar205._0_4_ = fVar228 * fVar272;
    fVar229 = local_300._4_4_;
    auVar205._4_4_ = fVar229 * fVar280;
    fVar230 = local_300._8_4_;
    auVar205._8_4_ = fVar230 * fVar281;
    fVar231 = local_300._12_4_;
    auVar205._12_4_ = fVar231 * fVar282;
    fVar232 = local_300._16_4_;
    auVar205._16_4_ = fVar232 * fVar283;
    fVar239 = local_300._20_4_;
    auVar205._20_4_ = fVar239 * fVar284;
    fVar243 = local_300._24_4_;
    auVar205._24_4_ = fVar243 * fVar286;
    auVar205._28_4_ = 0;
    auVar92 = vfmsub231ps_fma(auVar205,auVar258,local_2c0);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar92),ZEXT1632(auVar92));
    auVar206._0_4_ = fVar195 * fVar195;
    auVar206._4_4_ = fVar214 * fVar214;
    auVar206._8_4_ = fVar216 * fVar216;
    auVar206._12_4_ = fVar218 * fVar218;
    auVar206._16_4_ = fVar182 * fVar182;
    auVar206._20_4_ = fVar183 * fVar183;
    auVar206._24_4_ = fVar184 * fVar184;
    auVar206._28_4_ = 0;
    auVar93 = vfmadd231ps_fma(auVar206,local_300,local_300);
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar93),local_2e0,local_2e0);
    auVar107 = vrcpps_avx(ZEXT1632(auVar144));
    auVar134._8_4_ = 0x3f800000;
    auVar134._0_8_ = 0x3f8000003f800000;
    auVar134._12_4_ = 0x3f800000;
    auVar134._16_4_ = 0x3f800000;
    auVar134._20_4_ = 0x3f800000;
    auVar134._24_4_ = 0x3f800000;
    auVar134._28_4_ = 0x3f800000;
    auVar93 = vfnmadd213ps_fma(auVar107,ZEXT1632(auVar144),auVar134);
    auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar107,auVar107);
    auVar14 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    local_a20 = vpermps_avx2(_DAT_01fb7720,auVar19);
    auVar22._4_4_ = fVar214 * auVar14._4_4_;
    auVar22._0_4_ = fVar195 * auVar14._0_4_;
    auVar22._8_4_ = fVar216 * auVar14._8_4_;
    auVar22._12_4_ = fVar218 * auVar14._12_4_;
    auVar22._16_4_ = fVar182 * auVar14._16_4_;
    auVar22._20_4_ = fVar183 * auVar14._20_4_;
    auVar22._24_4_ = fVar184 * auVar14._24_4_;
    auVar22._28_4_ = auVar107._28_4_;
    auVar91 = vfmsub231ps_fma(auVar22,local_a20,local_2e0);
    local_a40 = vpermps_avx2(_DAT_01fb7720,auVar258);
    auVar23._4_4_ = fVar245 * local_a40._4_4_;
    auVar23._0_4_ = fVar244 * local_a40._0_4_;
    auVar23._8_4_ = fVar294 * local_a40._8_4_;
    auVar23._12_4_ = fVar285 * local_a40._12_4_;
    auVar23._16_4_ = fVar287 * local_a40._16_4_;
    auVar23._20_4_ = fVar270 * local_a40._20_4_;
    auVar23._24_4_ = fVar271 * local_a40._24_4_;
    auVar23._28_4_ = 0;
    auVar96 = vfmsub231ps_fma(auVar23,auVar14,local_300);
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * auVar96._12_4_,
                                                 CONCAT48(auVar96._8_4_ * auVar96._8_4_,
                                                          CONCAT44(auVar96._4_4_ * auVar96._4_4_,
                                                                   auVar96._0_4_ * auVar96._0_4_))))
                              ,ZEXT1632(auVar91),ZEXT1632(auVar91));
    auVar237._0_4_ = fVar228 * local_a20._0_4_;
    auVar237._4_4_ = fVar229 * local_a20._4_4_;
    auVar237._8_4_ = fVar230 * local_a20._8_4_;
    auVar237._12_4_ = fVar231 * local_a20._12_4_;
    auVar237._16_4_ = fVar232 * local_a20._16_4_;
    auVar237._20_4_ = fVar239 * local_a20._20_4_;
    auVar237._24_4_ = fVar243 * local_a20._24_4_;
    auVar237._28_4_ = 0;
    auVar96 = vfmsub231ps_fma(auVar237,local_a40,local_2c0);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT1632(auVar96),ZEXT1632(auVar96));
    auVar107 = vmaxps_avx(ZEXT1632(CONCAT412(auVar93._12_4_ * auVar92._12_4_,
                                             CONCAT48(auVar93._8_4_ * auVar92._8_4_,
                                                      CONCAT44(auVar93._4_4_ * auVar92._4_4_,
                                                               auVar93._0_4_ * auVar92._0_4_)))),
                          ZEXT1632(CONCAT412(auVar91._12_4_ * auVar93._12_4_,
                                             CONCAT48(auVar91._8_4_ * auVar93._8_4_,
                                                      CONCAT44(auVar91._4_4_ * auVar93._4_4_,
                                                               auVar91._0_4_ * auVar93._0_4_)))));
    local_660._0_4_ = auVar125._0_4_ + fVar213;
    local_660._4_4_ = auVar125._4_4_ + fVar215;
    local_660._8_4_ = auVar125._8_4_ + fVar217;
    local_660._12_4_ = auVar125._12_4_ + fVar181;
    local_660._16_4_ = fVar160 * 0.0 + 0.0;
    local_660._20_4_ = fVar160 * 0.0 + 0.0;
    local_660._24_4_ = fVar160 * 0.0 + 0.0;
    local_660._28_4_ = fVar160 + 0.0;
    auVar118 = vsubps_avx(auVar222,auVar20);
    local_680 = vpermps_avx2(_DAT_01fb7720,auVar118);
    local_6a0 = vpermps_avx2(_DAT_01fb7720,auVar222);
    auVar118 = vmaxps_avx(auVar222,local_660);
    auVar279 = vmaxps_avx(local_680,local_6a0);
    auVar118 = vmaxps_avx(auVar118,auVar279);
    auVar279 = vrsqrtps_avx(ZEXT1632(auVar144));
    fVar213 = auVar279._0_4_;
    fVar215 = auVar279._4_4_;
    fVar217 = auVar279._8_4_;
    fVar181 = auVar279._12_4_;
    fVar160 = auVar279._16_4_;
    fVar219 = auVar279._20_4_;
    fVar227 = auVar279._24_4_;
    auVar78._4_4_ = fVar215 * fVar215 * fVar215 * auVar144._4_4_ * -0.5;
    auVar78._0_4_ = fVar213 * fVar213 * fVar213 * auVar144._0_4_ * -0.5;
    auVar78._8_4_ = fVar217 * fVar217 * fVar217 * auVar144._8_4_ * -0.5;
    auVar78._12_4_ = fVar181 * fVar181 * fVar181 * auVar144._12_4_ * -0.5;
    auVar78._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
    auVar78._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
    auVar78._24_4_ = fVar227 * fVar227 * fVar227 * -0.0;
    auVar78._28_4_ = DAT_01fb7720._28_4_;
    auVar207._8_4_ = 0x3fc00000;
    auVar207._0_8_ = 0x3fc000003fc00000;
    auVar207._12_4_ = 0x3fc00000;
    auVar207._16_4_ = 0x3fc00000;
    auVar207._20_4_ = 0x3fc00000;
    auVar207._24_4_ = 0x3fc00000;
    auVar207._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_fma(auVar78,auVar207,auVar279);
    fVar213 = auVar93._0_4_;
    fVar215 = auVar93._4_4_;
    auVar24._4_4_ = fVar229 * fVar215;
    auVar24._0_4_ = fVar228 * fVar213;
    fVar217 = auVar93._8_4_;
    auVar24._8_4_ = fVar230 * fVar217;
    fVar181 = auVar93._12_4_;
    auVar24._12_4_ = fVar231 * fVar181;
    auVar24._16_4_ = fVar232 * 0.0;
    auVar24._20_4_ = fVar239 * 0.0;
    uVar85 = auVar279._28_4_;
    auVar24._24_4_ = fVar243 * 0.0;
    auVar24._28_4_ = uVar85;
    auVar25._4_4_ = (float)local_820._4_4_ * fVar215 * fVar214;
    auVar25._0_4_ = (float)local_820._0_4_ * fVar213 * fVar195;
    auVar25._8_4_ = fStack_818 * fVar217 * fVar216;
    auVar25._12_4_ = fStack_814 * fVar181 * fVar218;
    auVar25._16_4_ = fStack_810 * fVar182 * 0.0;
    auVar25._20_4_ = fStack_80c * fVar183 * 0.0;
    auVar25._24_4_ = fStack_808 * fVar184 * 0.0;
    auVar25._28_4_ = local_300._28_4_;
    auVar92 = vfmadd231ps_fma(auVar25,auVar24,_local_800);
    auVar279 = vsubps_avx(ZEXT832(0) << 0x20,local_940);
    auVar242 = ZEXT3264(auVar279);
    fVar160 = auVar279._0_4_;
    fVar219 = auVar279._4_4_;
    auVar26._4_4_ = fVar219 * fVar215 * fVar214;
    auVar26._0_4_ = fVar160 * fVar213 * fVar195;
    fVar227 = auVar279._8_4_;
    auVar26._8_4_ = fVar227 * fVar217 * fVar216;
    fVar228 = auVar279._12_4_;
    auVar26._12_4_ = fVar228 * fVar181 * fVar218;
    fVar229 = auVar279._16_4_;
    auVar26._16_4_ = fVar229 * fVar182 * 0.0;
    fVar230 = auVar279._20_4_;
    auVar26._20_4_ = fVar230 * fVar183 * 0.0;
    fVar231 = auVar279._24_4_;
    auVar26._24_4_ = fVar231 * fVar184 * 0.0;
    auVar26._28_4_ = 0x3fc00000;
    auVar12 = vsubps_avx(ZEXT832(0) << 0x20,local_2a0);
    auVar238 = ZEXT3264(auVar12);
    auVar144 = vfmadd231ps_fma(auVar26,auVar12,auVar24);
    auVar27._4_4_ = fVar245 * fVar215;
    auVar27._0_4_ = fVar244 * fVar213;
    auVar27._8_4_ = fVar294 * fVar217;
    auVar27._12_4_ = fVar285 * fVar181;
    auVar27._16_4_ = fVar287 * 0.0;
    auVar27._20_4_ = fVar270 * 0.0;
    auVar27._24_4_ = fVar271 * 0.0;
    auVar27._28_4_ = uVar85;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar27,_local_6e0);
    auVar269 = ZEXT1664(auVar92);
    auVar275 = ZEXT832(0) << 0x20;
    auVar210 = vsubps_avx(auVar275,_local_960);
    auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar210,auVar27);
    local_6c0 = vsqrtps_avx(auVar107);
    auVar28._4_4_ = (float)local_820._4_4_ * fVar219;
    auVar28._0_4_ = (float)local_820._0_4_ * fVar160;
    auVar28._8_4_ = fStack_818 * fVar227;
    auVar28._12_4_ = fStack_814 * fVar228;
    auVar28._16_4_ = fStack_810 * fVar229;
    auVar28._20_4_ = fStack_80c * fVar230;
    auVar28._24_4_ = fStack_808 * fVar231;
    auVar28._28_4_ = uVar85;
    auVar125 = vfmadd231ps_fma(auVar28,_local_800,auVar12);
    auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),_local_6e0,auVar210);
    fVar195 = auVar144._0_4_;
    fVar232 = auVar92._0_4_;
    fVar214 = auVar144._4_4_;
    fVar239 = auVar92._4_4_;
    fVar216 = auVar144._8_4_;
    fVar243 = auVar92._8_4_;
    fVar218 = auVar144._12_4_;
    fVar244 = auVar92._12_4_;
    auVar29._28_4_ = uStack_804;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar244 * fVar218,
                            CONCAT48(fVar243 * fVar216,CONCAT44(fVar239 * fVar214,fVar232 * fVar195)
                                    )));
    auVar116 = vsubps_avx(ZEXT1632(auVar125),auVar29);
    auVar30._4_4_ = fVar219 * fVar219;
    auVar30._0_4_ = fVar160 * fVar160;
    auVar30._8_4_ = fVar227 * fVar227;
    auVar30._12_4_ = fVar228 * fVar228;
    auVar30._16_4_ = fVar229 * fVar229;
    auVar30._20_4_ = fVar230 * fVar230;
    auVar30._24_4_ = fVar231 * fVar231;
    auVar30._28_4_ = uStack_804;
    auVar125 = vfmadd231ps_fma(auVar30,auVar12,auVar12);
    auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar210,auVar210);
    auVar31._28_4_ = auVar107._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar218 * fVar218,
                            CONCAT48(fVar216 * fVar216,CONCAT44(fVar214 * fVar214,fVar195 * fVar195)
                                    )));
    auVar135 = vsubps_avx(ZEXT1632(auVar125),auVar31);
    fVar195 = (local_6c0._0_4_ + auVar118._0_4_) * 1.0000002;
    fVar214 = (local_6c0._4_4_ + auVar118._4_4_) * 1.0000002;
    fVar216 = (local_6c0._8_4_ + auVar118._8_4_) * 1.0000002;
    fVar218 = (local_6c0._12_4_ + auVar118._12_4_) * 1.0000002;
    fVar182 = (local_6c0._16_4_ + auVar118._16_4_) * 1.0000002;
    fVar183 = (local_6c0._20_4_ + auVar118._20_4_) * 1.0000002;
    fVar184 = (local_6c0._24_4_ + auVar118._24_4_) * 1.0000002;
    auVar32._4_4_ = fVar214 * fVar214;
    auVar32._0_4_ = fVar195 * fVar195;
    auVar32._8_4_ = fVar216 * fVar216;
    auVar32._12_4_ = fVar218 * fVar218;
    auVar32._16_4_ = fVar182 * fVar182;
    auVar32._20_4_ = fVar183 * fVar183;
    auVar32._24_4_ = fVar184 * fVar184;
    auVar32._28_4_ = local_6c0._28_4_ + auVar118._28_4_;
    fVar245 = auVar116._0_4_ + auVar116._0_4_;
    fVar294 = auVar116._4_4_ + auVar116._4_4_;
    auVar288._0_8_ = CONCAT44(fVar294,fVar245);
    auVar288._8_4_ = auVar116._8_4_ + auVar116._8_4_;
    auVar288._12_4_ = auVar116._12_4_ + auVar116._12_4_;
    auVar288._16_4_ = auVar116._16_4_ + auVar116._16_4_;
    auVar288._20_4_ = auVar116._20_4_ + auVar116._20_4_;
    auVar288._24_4_ = auVar116._24_4_ + auVar116._24_4_;
    auVar288._28_4_ = auVar116._28_4_ + auVar116._28_4_;
    auVar118 = vsubps_avx(auVar135,auVar32);
    auVar267 = ZEXT1632(auVar92);
    local_980._28_4_ = local_6c0._28_4_;
    local_980._0_28_ =
         ZEXT1628(CONCAT412(fVar244 * fVar244,
                            CONCAT48(fVar243 * fVar243,CONCAT44(fVar239 * fVar239,fVar232 * fVar232)
                                    )));
    local_3c0 = vsubps_avx(local_240,local_980);
    local_260._4_4_ = fVar294 * fVar294;
    local_260._0_4_ = fVar245 * fVar245;
    local_260._8_4_ = auVar288._8_4_ * auVar288._8_4_;
    local_260._12_4_ = auVar288._12_4_ * auVar288._12_4_;
    local_260._16_4_ = auVar288._16_4_ * auVar288._16_4_;
    local_260._20_4_ = auVar288._20_4_ * auVar288._20_4_;
    local_260._24_4_ = auVar288._24_4_ * auVar288._24_4_;
    local_260._28_4_ = local_240._28_4_;
    fVar195 = local_3c0._0_4_;
    local_280 = fVar195 * 4.0;
    fVar214 = local_3c0._4_4_;
    fStack_27c = fVar214 * 4.0;
    fVar216 = local_3c0._8_4_;
    fStack_278 = fVar216 * 4.0;
    fVar218 = local_3c0._12_4_;
    fStack_274 = fVar218 * 4.0;
    fVar182 = local_3c0._16_4_;
    fStack_270 = fVar182 * 4.0;
    fVar183 = local_3c0._20_4_;
    fStack_26c = fVar183 * 4.0;
    fVar184 = local_3c0._24_4_;
    fStack_268 = fVar184 * 4.0;
    uStack_264 = 0x40800000;
    auVar33._4_4_ = auVar118._4_4_ * fStack_27c;
    auVar33._0_4_ = auVar118._0_4_ * local_280;
    auVar33._8_4_ = auVar118._8_4_ * fStack_278;
    auVar33._12_4_ = auVar118._12_4_ * fStack_274;
    auVar33._16_4_ = auVar118._16_4_ * fStack_270;
    auVar33._20_4_ = auVar118._20_4_ * fStack_26c;
    auVar33._24_4_ = auVar118._24_4_ * fStack_268;
    auVar33._28_4_ = 0x40800000;
    auVar116 = vsubps_avx(local_260,auVar33);
    auVar107 = vcmpps_avx(auVar116,auVar275,5);
    auVar110._0_4_ = fVar195 + fVar195;
    auVar110._4_4_ = fVar214 + fVar214;
    auVar110._8_4_ = fVar216 + fVar216;
    auVar110._12_4_ = fVar218 + fVar218;
    auVar110._16_4_ = fVar182 + fVar182;
    auVar110._20_4_ = fVar183 + fVar183;
    auVar110._24_4_ = fVar184 + fVar184;
    auVar110._28_4_ = local_3c0._28_4_ + local_3c0._28_4_;
    local_320 = ZEXT1632(auVar93);
    auVar208 = ZEXT1632(auVar144);
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0x7f,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar107 >> 0xbf,0) == '\0') &&
        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar107[0x1f])
    {
      local_900._8_4_ = 0x7f800000;
      local_900._0_8_ = 0x7f8000007f800000;
      local_900._12_4_ = 0x7f800000;
      local_900._16_4_ = 0x7f800000;
      local_900._20_4_ = 0x7f800000;
      local_900._24_4_ = 0x7f800000;
      local_900._28_4_ = 0x7f800000;
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
    }
    else {
      auVar11 = vsqrtps_avx(auVar116);
      auVar275 = vcmpps_avx(auVar116,auVar275,5);
      auVar116 = vrcpps_avx(auVar110);
      auVar111._8_4_ = 0x3f800000;
      auVar111._0_8_ = 0x3f8000003f800000;
      auVar111._12_4_ = 0x3f800000;
      auVar111._16_4_ = 0x3f800000;
      auVar111._20_4_ = 0x3f800000;
      auVar111._24_4_ = 0x3f800000;
      auVar111._28_4_ = 0x3f800000;
      auVar93 = vfnmadd213ps_fma(auVar116,auVar110,auVar111);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar116,auVar116);
      auVar289._0_8_ = CONCAT44(fVar294,fVar245) ^ 0x8000000080000000;
      auVar289._8_4_ = -auVar288._8_4_;
      auVar289._12_4_ = -auVar288._12_4_;
      auVar289._16_4_ = -auVar288._16_4_;
      auVar289._20_4_ = -auVar288._20_4_;
      auVar289._24_4_ = -auVar288._24_4_;
      auVar289._28_4_ = -auVar288._28_4_;
      auVar116 = vsubps_avx(auVar289,auVar11);
      auVar34._4_4_ = auVar116._4_4_ * auVar93._4_4_;
      auVar34._0_4_ = auVar116._0_4_ * auVar93._0_4_;
      auVar34._8_4_ = auVar116._8_4_ * auVar93._8_4_;
      auVar34._12_4_ = auVar116._12_4_ * auVar93._12_4_;
      auVar34._16_4_ = auVar116._16_4_ * 0.0;
      auVar34._20_4_ = auVar116._20_4_ * 0.0;
      auVar34._24_4_ = auVar116._24_4_ * 0.0;
      auVar34._28_4_ = auVar116._28_4_;
      auVar116 = vsubps_avx(auVar11,auVar288);
      auVar277._0_4_ = auVar116._0_4_ * auVar93._0_4_;
      auVar277._4_4_ = auVar116._4_4_ * auVar93._4_4_;
      auVar277._8_4_ = auVar116._8_4_ * auVar93._8_4_;
      auVar277._12_4_ = auVar116._12_4_ * auVar93._12_4_;
      auVar277._16_4_ = auVar116._16_4_ * 0.0;
      auVar277._20_4_ = auVar116._20_4_ * 0.0;
      auVar277._24_4_ = auVar116._24_4_ * 0.0;
      auVar277._28_4_ = 0;
      auVar93 = vfmadd213ps_fma(auVar267,auVar34,auVar208);
      local_380 = fVar213 * auVar93._0_4_;
      fStack_37c = fVar215 * auVar93._4_4_;
      fStack_378 = fVar217 * auVar93._8_4_;
      fStack_374 = fVar181 * auVar93._12_4_;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar116 = vandps_avx(local_980,local_700);
      auVar116 = vmaxps_avx(local_620,auVar116);
      auVar35._4_4_ = auVar116._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar116._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar116._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar116._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar116._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar116._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar116._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar116._28_4_;
      auVar116 = vandps_avx(local_3c0,local_700);
      auVar116 = vcmpps_avx(auVar116,auVar35,1);
      auVar93 = vfmadd213ps_fma(auVar267,auVar277,auVar208);
      auVar112._8_4_ = 0x7f800000;
      auVar112._0_8_ = 0x7f8000007f800000;
      auVar112._12_4_ = 0x7f800000;
      auVar112._16_4_ = 0x7f800000;
      auVar112._20_4_ = 0x7f800000;
      auVar112._24_4_ = 0x7f800000;
      auVar112._28_4_ = 0x7f800000;
      local_900 = vblendvps_avx(auVar112,auVar34,auVar275);
      local_3a0 = fVar213 * auVar93._0_4_;
      fStack_39c = fVar215 * auVar93._4_4_;
      fStack_398 = fVar217 * auVar93._8_4_;
      fStack_394 = fVar181 * auVar93._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x7f800000;
      auVar174._8_4_ = 0xff800000;
      auVar174._0_8_ = 0xff800000ff800000;
      auVar174._12_4_ = 0xff800000;
      auVar174._16_4_ = 0xff800000;
      auVar174._20_4_ = 0xff800000;
      auVar174._24_4_ = 0xff800000;
      auVar174._28_4_ = 0xff800000;
      auVar276 = vblendvps_avx(auVar174,auVar277,auVar275);
      auVar11 = auVar275 & auVar116;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar107 = vandps_avx(auVar116,auVar275);
        auVar118 = vcmpps_avx(auVar118,_DAT_01f7b000,2);
        auVar224._8_4_ = 0xff800000;
        auVar224._0_8_ = 0xff800000ff800000;
        auVar224._12_4_ = 0xff800000;
        auVar224._16_4_ = 0xff800000;
        auVar224._20_4_ = 0xff800000;
        auVar224._24_4_ = 0xff800000;
        auVar224._28_4_ = 0xff800000;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar116 = vblendvps_avx(auVar122,auVar224,auVar118);
        auVar93 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
        auVar11 = vpmovsxwd_avx2(auVar93);
        local_900 = vblendvps_avx(local_900,auVar116,auVar11);
        auVar116 = vblendvps_avx(auVar224,auVar122,auVar118);
        auVar276 = vblendvps_avx(auVar276,auVar116,auVar11);
        auVar179._0_8_ = auVar107._0_8_ ^ 0xffffffffffffffff;
        auVar179._8_4_ = auVar107._8_4_ ^ 0xffffffff;
        auVar179._12_4_ = auVar107._12_4_ ^ 0xffffffff;
        auVar179._16_4_ = auVar107._16_4_ ^ 0xffffffff;
        auVar179._20_4_ = auVar107._20_4_ ^ 0xffffffff;
        auVar179._24_4_ = auVar107._24_4_ ^ 0xffffffff;
        auVar179._28_4_ = auVar107._28_4_ ^ 0xffffffff;
        auVar107 = vorps_avx(auVar118,auVar179);
        auVar107 = vandps_avx(auVar275,auVar107);
      }
    }
    auVar261 = ZEXT3264(auVar118);
    auVar226 = ZEXT3264(auVar135);
    auVar118 = local_600 & auVar107;
    fVar195 = (float)local_9a0._0_4_;
    fVar214 = (float)local_9a0._4_4_;
    fVar216 = fStack_998;
    fVar218 = fStack_994;
    fVar182 = fStack_990;
    fVar183 = fStack_98c;
    fVar184 = fStack_988;
    fVar232 = fStack_984;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar118 >> 0x7f,0) != '\0') ||
          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar118 >> 0xbf,0) != '\0') ||
        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar118[0x1f] < '\0') {
      auVar261 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar239 = *(float *)(ray + k * 4 + 0x80) - (float)local_8d0._0_4_;
      auVar175._4_4_ = fVar239;
      auVar175._0_4_ = fVar239;
      auVar175._8_4_ = fVar239;
      auVar175._12_4_ = fVar239;
      auVar175._16_4_ = fVar239;
      auVar175._20_4_ = fVar239;
      auVar175._24_4_ = fVar239;
      auVar175._28_4_ = fVar239;
      auVar116 = vminps_avx(auVar175,auVar276);
      auVar36._4_4_ = fVar219 * fVar280;
      auVar36._0_4_ = fVar160 * fVar272;
      auVar36._8_4_ = fVar227 * fVar281;
      auVar36._12_4_ = fVar228 * fVar282;
      auVar36._16_4_ = fVar229 * fVar283;
      auVar36._20_4_ = fVar230 * fVar284;
      auVar36._24_4_ = fVar231 * fVar286;
      auVar36._28_4_ = local_600._28_4_;
      auVar93 = vfmadd213ps_fma(auVar12,auVar258,auVar36);
      auVar74._4_4_ = fStack_35c;
      auVar74._0_4_ = local_360;
      auVar74._8_4_ = fStack_358;
      auVar74._12_4_ = fStack_354;
      auVar74._16_4_ = fStack_350;
      auVar74._20_4_ = fStack_34c;
      auVar74._24_4_ = fStack_348;
      auVar74._28_4_ = fStack_344;
      auVar12 = vmaxps_avx(auVar74,local_900);
      auVar92 = vfmadd213ps_fma(auVar210,local_7e0,ZEXT1632(auVar93));
      auVar37._4_4_ = fVar280 * (float)local_820._4_4_;
      auVar37._0_4_ = fVar272 * (float)local_820._0_4_;
      auVar37._8_4_ = fVar281 * fStack_818;
      auVar37._12_4_ = fVar282 * fStack_814;
      auVar37._16_4_ = fVar283 * fStack_810;
      auVar37._20_4_ = fVar284 * fStack_80c;
      auVar37._24_4_ = fVar286 * fStack_808;
      auVar37._28_4_ = auVar279._28_4_;
      auVar93 = vfmadd231ps_fma(auVar37,auVar258,_local_800);
      auVar144 = vfmadd231ps_fma(ZEXT1632(auVar93),_local_6e0,local_7e0);
      auVar118 = vandps_avx(ZEXT1632(auVar144),local_700);
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar113._16_4_ = 0x219392ef;
      auVar113._20_4_ = 0x219392ef;
      auVar113._24_4_ = 0x219392ef;
      auVar113._28_4_ = 0x219392ef;
      auVar279 = vcmpps_avx(auVar118,auVar113,1);
      auVar118 = vrcpps_avx(ZEXT1632(auVar144));
      auVar114._8_4_ = 0x3f800000;
      auVar114._0_8_ = 0x3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar114._16_4_ = 0x3f800000;
      auVar114._20_4_ = 0x3f800000;
      auVar114._24_4_ = 0x3f800000;
      auVar114._28_4_ = 0x3f800000;
      auVar210 = ZEXT1632(auVar144);
      auVar93 = vfnmadd213ps_fma(auVar118,auVar210,auVar114);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar118,auVar118);
      auVar290._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
      auVar290._8_4_ = auVar144._8_4_ ^ 0x80000000;
      auVar290._12_4_ = auVar144._12_4_ ^ 0x80000000;
      auVar290._16_4_ = 0x80000000;
      auVar290._20_4_ = 0x80000000;
      auVar290._24_4_ = 0x80000000;
      auVar290._28_4_ = 0x80000000;
      auVar38._4_4_ = auVar93._4_4_ * -auVar92._4_4_;
      auVar38._0_4_ = auVar93._0_4_ * -auVar92._0_4_;
      auVar38._8_4_ = auVar93._8_4_ * -auVar92._8_4_;
      auVar38._12_4_ = auVar93._12_4_ * -auVar92._12_4_;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      auVar118 = vcmpps_avx(auVar210,auVar290,1);
      auVar118 = vorps_avx(auVar279,auVar118);
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar118 = vblendvps_avx(auVar38,auVar278,auVar118);
      auVar12 = vmaxps_avx(auVar12,auVar118);
      auVar118 = vcmpps_avx(auVar210,auVar290,6);
      auVar118 = vorps_avx(auVar279,auVar118);
      auVar291._8_4_ = 0x7f800000;
      auVar291._0_8_ = 0x7f8000007f800000;
      auVar291._12_4_ = 0x7f800000;
      auVar291._16_4_ = 0x7f800000;
      auVar291._20_4_ = 0x7f800000;
      auVar291._24_4_ = 0x7f800000;
      auVar291._28_4_ = 0x7f800000;
      auVar118 = vblendvps_avx(auVar38,auVar291,auVar118);
      auVar210 = vminps_avx(auVar116,auVar118);
      fVar160 = -local_a20._0_4_;
      fVar219 = -local_a20._4_4_;
      fVar227 = -local_a20._8_4_;
      fVar228 = -local_a20._12_4_;
      fVar229 = -local_a20._16_4_;
      fVar230 = -local_a20._20_4_;
      fVar231 = -local_a20._24_4_;
      auVar241._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
      auVar241._8_4_ = -local_a40._8_4_;
      auVar241._12_4_ = -local_a40._12_4_;
      auVar241._16_4_ = -local_a40._16_4_;
      auVar241._20_4_ = -local_a40._20_4_;
      auVar241._24_4_ = -local_a40._24_4_;
      auVar241._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar279 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar118 = vsubps_avx(auVar279,auVar13);
      auVar279 = vsubps_avx(auVar279,local_a80);
      auVar39._4_4_ = auVar279._4_4_ * fVar219;
      auVar39._0_4_ = auVar279._0_4_ * fVar160;
      auVar39._8_4_ = auVar279._8_4_ * fVar227;
      auVar39._12_4_ = auVar279._12_4_ * fVar228;
      auVar39._16_4_ = auVar279._16_4_ * fVar229;
      auVar39._20_4_ = auVar279._20_4_ * fVar230;
      auVar39._24_4_ = auVar279._24_4_ * fVar231;
      auVar39._28_4_ = auVar279._28_4_;
      auVar93 = vfmadd231ps_fma(auVar39,auVar241,auVar118);
      uStack_b84 = auVar14._28_4_;
      auVar251._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
      auVar251._8_4_ = -auVar14._8_4_;
      auVar251._12_4_ = -auVar14._12_4_;
      auVar251._16_4_ = -auVar14._16_4_;
      auVar251._20_4_ = -auVar14._20_4_;
      auVar251._24_4_ = -auVar14._24_4_;
      auVar251._28_4_ = uStack_b84 ^ 0x80000000;
      auVar118 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar209);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar251,auVar118);
      auVar40._4_4_ = fVar219 * (float)local_820._4_4_;
      auVar40._0_4_ = fVar160 * (float)local_820._0_4_;
      auVar40._8_4_ = fVar227 * fStack_818;
      auVar40._12_4_ = fVar228 * fStack_814;
      auVar40._16_4_ = fVar229 * fStack_810;
      auVar40._20_4_ = fVar230 * fStack_80c;
      auVar40._24_4_ = fVar231 * fStack_808;
      auVar40._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar93 = vfmadd231ps_fma(auVar40,auVar241,_local_800);
      auVar144 = vfmadd231ps_fma(ZEXT1632(auVar93),_local_6e0,auVar251);
      auVar118 = vandps_avx(ZEXT1632(auVar144),local_700);
      auVar116 = vrcpps_avx(ZEXT1632(auVar144));
      auVar155._8_4_ = 0x219392ef;
      auVar155._0_8_ = 0x219392ef219392ef;
      auVar155._12_4_ = 0x219392ef;
      auVar155._16_4_ = 0x219392ef;
      auVar155._20_4_ = 0x219392ef;
      auVar155._24_4_ = 0x219392ef;
      auVar155._28_4_ = 0x219392ef;
      auVar279 = vcmpps_avx(auVar118,auVar155,1);
      auVar209 = ZEXT1632(auVar144);
      auVar93 = vfnmadd213ps_fma(auVar116,auVar209,auVar114);
      auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar116,auVar116);
      auVar252._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
      auVar252._8_4_ = auVar144._8_4_ ^ 0x80000000;
      auVar252._12_4_ = auVar144._12_4_ ^ 0x80000000;
      auVar252._16_4_ = 0x80000000;
      auVar252._20_4_ = 0x80000000;
      auVar252._24_4_ = 0x80000000;
      auVar252._28_4_ = 0x80000000;
      auVar41._4_4_ = auVar93._4_4_ * -auVar92._4_4_;
      auVar41._0_4_ = auVar93._0_4_ * -auVar92._0_4_;
      auVar41._8_4_ = auVar93._8_4_ * -auVar92._8_4_;
      auVar41._12_4_ = auVar93._12_4_ * -auVar92._12_4_;
      auVar41._16_4_ = 0x80000000;
      auVar41._20_4_ = 0x80000000;
      auVar41._24_4_ = 0x80000000;
      auVar41._28_4_ = 0x80000000;
      auVar118 = vcmpps_avx(auVar209,auVar252,1);
      auVar118 = vorps_avx(auVar279,auVar118);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar118 = vblendvps_avx(auVar41,auVar115,auVar118);
      local_920 = vmaxps_avx(auVar12,auVar118);
      auVar118 = vcmpps_avx(auVar209,auVar252,6);
      auVar118 = vorps_avx(auVar279,auVar118);
      auVar118 = vblendvps_avx(auVar41,auVar291,auVar118);
      auVar238 = ZEXT3264(auVar107);
      auVar107 = vandps_avx(auVar107,local_600);
      local_3e0 = vminps_avx(auVar210,auVar118);
      auVar118 = vcmpps_avx(local_920,local_3e0,2);
      auVar279 = auVar107 & auVar118;
      if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar279 >> 0x7f,0) != '\0') ||
            (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar279 >> 0xbf,0) != '\0') ||
          (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar279[0x1f] < '\0') {
        auVar73._4_4_ = fStack_37c;
        auVar73._0_4_ = local_380;
        auVar73._8_4_ = fStack_378;
        auVar73._12_4_ = fStack_374;
        auVar73._16_4_ = uStack_370;
        auVar73._20_4_ = uStack_36c;
        auVar73._24_4_ = uStack_368;
        auVar73._28_4_ = uStack_364;
        auVar279 = vminps_avx(auVar73,auVar114);
        auVar238 = ZEXT864(0) << 0x20;
        auVar279 = vmaxps_avx(auVar279,ZEXT832(0) << 0x20);
        auVar72._4_4_ = fStack_39c;
        auVar72._0_4_ = local_3a0;
        auVar72._8_4_ = fStack_398;
        auVar72._12_4_ = fStack_394;
        auVar72._16_4_ = uStack_390;
        auVar72._20_4_ = uStack_38c;
        auVar72._24_4_ = uStack_388;
        auVar72._28_4_ = uStack_384;
        auVar12 = vminps_avx(auVar72,auVar114);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        auVar42._4_4_ = (auVar279._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar279._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar279._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar279._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar279._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar279._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar279._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar279._28_4_ + 7.0;
        auVar93 = vfmadd213ps_fma(auVar42,auVar108,auVar202);
        auVar43._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar12._28_4_ + 7.0;
        auVar92 = vfmadd213ps_fma(auVar43,auVar108,auVar202);
        auVar279 = vminps_avx(auVar222,local_660);
        auVar12 = vminps_avx(local_680,local_6a0);
        auVar279 = vminps_avx(auVar279,auVar12);
        auVar279 = vsubps_avx(auVar279,local_6c0);
        auVar118 = vandps_avx(auVar107,auVar118);
        local_1a0 = ZEXT1632(auVar93);
        local_1c0 = ZEXT1632(auVar92);
        auVar44._4_4_ = auVar279._4_4_ * 0.99999976;
        auVar44._0_4_ = auVar279._0_4_ * 0.99999976;
        auVar44._8_4_ = auVar279._8_4_ * 0.99999976;
        auVar44._12_4_ = auVar279._12_4_ * 0.99999976;
        auVar44._16_4_ = auVar279._16_4_ * 0.99999976;
        auVar44._20_4_ = auVar279._20_4_ * 0.99999976;
        auVar44._24_4_ = auVar279._24_4_ * 0.99999976;
        auVar44._28_4_ = auVar279._28_4_;
        auVar107 = vmaxps_avx(ZEXT832(0) << 0x20,auVar44);
        auVar45._4_4_ = auVar107._4_4_ * auVar107._4_4_;
        auVar45._0_4_ = auVar107._0_4_ * auVar107._0_4_;
        auVar45._8_4_ = auVar107._8_4_ * auVar107._8_4_;
        auVar45._12_4_ = auVar107._12_4_ * auVar107._12_4_;
        auVar45._16_4_ = auVar107._16_4_ * auVar107._16_4_;
        auVar45._20_4_ = auVar107._20_4_ * auVar107._20_4_;
        uVar85 = auVar107._28_4_;
        auVar45._24_4_ = auVar107._24_4_ * auVar107._24_4_;
        auVar45._28_4_ = uVar85;
        auVar107 = vsubps_avx(auVar135,auVar45);
        auVar46._4_4_ = auVar107._4_4_ * fStack_27c;
        auVar46._0_4_ = auVar107._0_4_ * local_280;
        auVar46._8_4_ = auVar107._8_4_ * fStack_278;
        auVar46._12_4_ = auVar107._12_4_ * fStack_274;
        auVar46._16_4_ = auVar107._16_4_ * fStack_270;
        auVar46._20_4_ = auVar107._20_4_ * fStack_26c;
        auVar46._24_4_ = auVar107._24_4_ * fStack_268;
        auVar46._28_4_ = uVar85;
        auVar12 = vsubps_avx(local_260,auVar46);
        auVar279 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
        if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar279 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar279 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar279 >> 0x7f,0) == '\0') &&
              (auVar279 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar279 >> 0xbf,0) == '\0') &&
            (auVar279 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar279[0x1f]) {
          auVar209 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar250 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar116 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar135 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar180 = ZEXT864(0) << 0x20;
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar268._8_4_ = 0xff800000;
          auVar268._0_8_ = 0xff800000ff800000;
          auVar268._12_4_ = 0xff800000;
          auVar268._16_4_ = 0xff800000;
          auVar268._20_4_ = 0xff800000;
          auVar268._24_4_ = 0xff800000;
          auVar268._28_4_ = 0xff800000;
        }
        else {
          auVar210 = vrcpps_avx(auVar110);
          auVar93 = vfnmadd213ps_fma(auVar110,auVar210,auVar114);
          auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar210,auVar210);
          auVar210 = vsqrtps_avx(auVar12);
          auVar253._0_8_ = auVar288._0_8_ ^ 0x8000000080000000;
          auVar253._8_4_ = -auVar288._8_4_;
          auVar253._12_4_ = -auVar288._12_4_;
          auVar253._16_4_ = -auVar288._16_4_;
          auVar253._20_4_ = -auVar288._20_4_;
          auVar253._24_4_ = -auVar288._24_4_;
          auVar253._28_4_ = -auVar288._28_4_;
          auVar116 = vsubps_avx(auVar253,auVar210);
          auVar210 = vsubps_avx(auVar210,auVar288);
          fVar160 = auVar116._0_4_ * auVar93._0_4_;
          fVar219 = auVar116._4_4_ * auVar93._4_4_;
          auVar47._4_4_ = fVar219;
          auVar47._0_4_ = fVar160;
          fVar227 = auVar116._8_4_ * auVar93._8_4_;
          auVar47._8_4_ = fVar227;
          fVar228 = auVar116._12_4_ * auVar93._12_4_;
          auVar47._12_4_ = fVar228;
          fVar229 = auVar116._16_4_ * 0.0;
          auVar47._16_4_ = fVar229;
          fVar230 = auVar116._20_4_ * 0.0;
          auVar47._20_4_ = fVar230;
          fVar231 = auVar116._24_4_ * 0.0;
          auVar47._24_4_ = fVar231;
          auVar47._28_4_ = uVar85;
          fVar239 = auVar210._0_4_ * auVar93._0_4_;
          fVar243 = auVar210._4_4_ * auVar93._4_4_;
          auVar48._4_4_ = fVar243;
          auVar48._0_4_ = fVar239;
          fVar244 = auVar210._8_4_ * auVar93._8_4_;
          auVar48._8_4_ = fVar244;
          fVar245 = auVar210._12_4_ * auVar93._12_4_;
          auVar48._12_4_ = fVar245;
          fVar294 = auVar210._16_4_ * 0.0;
          auVar48._16_4_ = fVar294;
          fVar285 = auVar210._20_4_ * 0.0;
          auVar48._20_4_ = fVar285;
          fVar287 = auVar210._24_4_ * 0.0;
          auVar48._24_4_ = fVar287;
          auVar48._28_4_ = auVar279._28_4_;
          auVar93 = vfmadd213ps_fma(auVar267,auVar47,auVar208);
          auVar92 = vfmadd213ps_fma(auVar267,auVar48,auVar208);
          auVar210 = ZEXT1632(CONCAT412(fVar181 * auVar93._12_4_,
                                        CONCAT48(fVar217 * auVar93._8_4_,
                                                 CONCAT44(fVar215 * auVar93._4_4_,
                                                          fVar213 * auVar93._0_4_))));
          auVar116 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar181,
                                        CONCAT48(auVar92._8_4_ * fVar217,
                                                 CONCAT44(auVar92._4_4_ * fVar215,
                                                          auVar92._0_4_ * fVar213))));
          auVar93 = vfmadd213ps_fma(local_2e0,auVar210,_local_960);
          auVar92 = vfmadd213ps_fma(local_2e0,auVar116,_local_960);
          auVar144 = vfmadd213ps_fma(local_300,auVar210,local_2a0);
          auVar125 = vfmadd213ps_fma(local_300,auVar116,local_2a0);
          auVar91 = vfmadd213ps_fma(auVar210,local_2c0,local_940);
          auVar96 = vfmadd213ps_fma(local_2c0,auVar116,local_940);
          auVar49._4_4_ = (float)local_6e0._4_4_ * fVar219;
          auVar49._0_4_ = (float)local_6e0._0_4_ * fVar160;
          auVar49._8_4_ = fStack_6d8 * fVar227;
          auVar49._12_4_ = fStack_6d4 * fVar228;
          auVar49._16_4_ = fStack_6d0 * fVar229;
          auVar49._20_4_ = fStack_6cc * fVar230;
          auVar49._24_4_ = fStack_6c8 * fVar231;
          auVar49._28_4_ = 0;
          auVar116 = vsubps_avx(auVar49,ZEXT1632(auVar93));
          auVar50._4_4_ = (float)local_800._4_4_ * fVar219;
          auVar50._0_4_ = (float)local_800._0_4_ * fVar160;
          auVar50._8_4_ = fStack_7f8 * fVar227;
          auVar50._12_4_ = fStack_7f4 * fVar228;
          auVar50._16_4_ = fStack_7f0 * fVar229;
          auVar50._20_4_ = fStack_7ec * fVar230;
          auVar50._24_4_ = fStack_7e8 * fVar231;
          auVar50._28_4_ = 0x80000000;
          auVar135 = vsubps_avx(auVar50,ZEXT1632(auVar144));
          auVar156._0_4_ = (float)local_820._0_4_ * fVar160;
          auVar156._4_4_ = (float)local_820._4_4_ * fVar219;
          auVar156._8_4_ = fStack_818 * fVar227;
          auVar156._12_4_ = fStack_814 * fVar228;
          auVar156._16_4_ = fStack_810 * fVar229;
          auVar156._20_4_ = fStack_80c * fVar230;
          auVar156._24_4_ = fStack_808 * fVar231;
          auVar156._28_4_ = 0;
          auVar210 = vsubps_avx(auVar156,ZEXT1632(auVar91));
          auVar180 = ZEXT3264(auVar210);
          auVar211._0_4_ = fVar239 * (float)local_6e0._0_4_;
          auVar211._4_4_ = fVar243 * (float)local_6e0._4_4_;
          auVar211._8_4_ = fVar244 * fStack_6d8;
          auVar211._12_4_ = fVar245 * fStack_6d4;
          auVar211._16_4_ = fVar294 * fStack_6d0;
          auVar211._20_4_ = fVar285 * fStack_6cc;
          auVar211._24_4_ = fVar287 * fStack_6c8;
          auVar211._28_4_ = 0;
          auVar210 = vsubps_avx(auVar211,ZEXT1632(auVar92));
          auVar238 = ZEXT3264(auVar210);
          auVar51._4_4_ = (float)local_800._4_4_ * fVar243;
          auVar51._0_4_ = (float)local_800._0_4_ * fVar239;
          auVar51._8_4_ = fStack_7f8 * fVar244;
          auVar51._12_4_ = fStack_7f4 * fVar245;
          auVar51._16_4_ = fStack_7f0 * fVar294;
          auVar51._20_4_ = fStack_7ec * fVar285;
          auVar51._24_4_ = fStack_7e8 * fVar287;
          auVar51._28_4_ = 0;
          auVar209 = vsubps_avx(auVar51,ZEXT1632(auVar125));
          auVar52._4_4_ = (float)local_820._4_4_ * fVar243;
          auVar52._0_4_ = (float)local_820._0_4_ * fVar239;
          auVar52._8_4_ = fStack_818 * fVar244;
          auVar52._12_4_ = fStack_814 * fVar245;
          auVar52._16_4_ = fStack_810 * fVar294;
          auVar52._20_4_ = fStack_80c * fVar285;
          auVar52._24_4_ = fStack_808 * fVar287;
          auVar52._28_4_ = uStack_7e4;
          auVar210 = vsubps_avx(auVar52,ZEXT1632(auVar96));
          auVar250 = auVar210._0_28_;
          auVar210 = vcmpps_avx(auVar12,_DAT_01f7b000,5);
          auVar265._8_4_ = 0x7f800000;
          auVar265._0_8_ = 0x7f8000007f800000;
          auVar265._12_4_ = 0x7f800000;
          auVar265._16_4_ = 0x7f800000;
          auVar265._20_4_ = 0x7f800000;
          auVar265._24_4_ = 0x7f800000;
          auVar265._28_4_ = 0x7f800000;
          auVar264 = vblendvps_avx(auVar265,auVar47,auVar210);
          auVar12 = vandps_avx(local_700,local_980);
          auVar12 = vmaxps_avx(local_620,auVar12);
          auVar53._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar53._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar53._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar53._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar53._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar53._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar53._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar53._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(local_700,local_3c0);
          auVar12 = vcmpps_avx(auVar12,auVar53,1);
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          auVar268 = vblendvps_avx(auVar223,auVar48,auVar210);
          auVar13 = auVar210 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar279 = vandps_avx(auVar12,auVar210);
            auVar12 = vcmpps_avx(auVar107,_DAT_01f7b000,2);
            auVar194._8_4_ = 0x7f800000;
            auVar194._0_8_ = 0x7f8000007f800000;
            auVar194._12_4_ = 0x7f800000;
            auVar194._16_4_ = 0x7f800000;
            auVar194._20_4_ = 0x7f800000;
            auVar194._24_4_ = 0x7f800000;
            auVar194._28_4_ = 0x7f800000;
            auVar292._8_4_ = 0xff800000;
            auVar292._0_8_ = 0xff800000ff800000;
            auVar292._12_4_ = 0xff800000;
            auVar292._16_4_ = 0xff800000;
            auVar292._20_4_ = 0xff800000;
            auVar292._24_4_ = 0xff800000;
            auVar292._28_4_ = 0xff800000;
            auVar107 = vblendvps_avx(auVar194,auVar292,auVar12);
            auVar93 = vpackssdw_avx(auVar279._0_16_,auVar279._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar93);
            auVar264 = vblendvps_avx(auVar264,auVar107,auVar13);
            auVar293._8_4_ = 0xff800000;
            auVar293._0_8_ = 0xff800000ff800000;
            auVar293._12_4_ = 0xff800000;
            auVar293._16_4_ = 0xff800000;
            auVar293._20_4_ = 0xff800000;
            auVar293._24_4_ = 0xff800000;
            auVar293._28_4_ = 0xff800000;
            auVar107 = vblendvps_avx(auVar293,auVar194,auVar12);
            auVar268 = vblendvps_avx(auVar268,auVar107,auVar13);
            auVar225._0_8_ = auVar279._0_8_ ^ 0xffffffffffffffff;
            auVar225._8_4_ = auVar279._8_4_ ^ 0xffffffff;
            auVar225._12_4_ = auVar279._12_4_ ^ 0xffffffff;
            auVar225._16_4_ = auVar279._16_4_ ^ 0xffffffff;
            auVar225._20_4_ = auVar279._20_4_ ^ 0xffffffff;
            auVar225._24_4_ = auVar279._24_4_ ^ 0xffffffff;
            auVar225._28_4_ = auVar279._28_4_ ^ 0xffffffff;
            auVar107 = vorps_avx(auVar12,auVar225);
            auVar279 = vandps_avx(auVar210,auVar107);
          }
        }
        local_440 = local_920;
        local_420 = vminps_avx(local_3e0,auVar264);
        _local_9c0 = vmaxps_avx(local_920,auVar268);
        auVar269 = ZEXT3264(_local_9c0);
        _local_400 = _local_9c0;
        auVar107 = vcmpps_avx(local_920,local_420,2);
        local_660 = vandps_avx(auVar107,auVar118);
        auVar12 = vcmpps_avx(_local_9c0,local_3e0,2);
        local_9e0 = vandps_avx(auVar12,auVar118);
        auVar118 = vorps_avx(local_660,local_9e0);
        auVar226 = ZEXT3264(_local_820);
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          auStack_898 = auVar108._8_24_;
          auVar54._4_4_ = auVar250._4_4_ * (float)local_820._4_4_;
          auVar54._0_4_ = auVar250._0_4_ * (float)local_820._0_4_;
          auVar54._8_4_ = auVar250._8_4_ * fStack_818;
          auVar54._12_4_ = auVar250._12_4_ * fStack_814;
          auVar54._16_4_ = auVar250._16_4_ * fStack_810;
          auVar54._20_4_ = auVar250._20_4_ * fStack_80c;
          auVar54._24_4_ = auVar250._24_4_ * fStack_808;
          auVar54._28_4_ = auVar118._28_4_;
          auVar93 = vfmadd213ps_fma(auVar209,_local_800,auVar54);
          auVar242 = ZEXT3264(_local_820);
          auVar226 = ZEXT3264(_local_6e0);
          auVar93 = vfmadd213ps_fma(auVar238._0_32_,_local_6e0,ZEXT1632(auVar93));
          auVar238 = ZEXT1664(auVar93);
          auVar177._0_8_ = auVar279._0_8_ ^ 0xffffffffffffffff;
          auVar177._8_4_ = auVar279._8_4_ ^ 0xffffffff;
          auVar177._12_4_ = auVar279._12_4_ ^ 0xffffffff;
          auVar177._16_4_ = auVar279._16_4_ ^ 0xffffffff;
          auVar177._20_4_ = auVar279._20_4_ ^ 0xffffffff;
          auVar177._24_4_ = auVar279._24_4_ ^ 0xffffffff;
          auVar177._28_4_ = auVar279._28_4_ ^ 0xffffffff;
          auVar107 = vandps_avx(local_700,ZEXT1632(auVar93));
          auVar212._8_4_ = 0x3e99999a;
          auVar212._0_8_ = 0x3e99999a3e99999a;
          auVar212._12_4_ = 0x3e99999a;
          auVar212._16_4_ = 0x3e99999a;
          auVar212._20_4_ = 0x3e99999a;
          auVar212._24_4_ = 0x3e99999a;
          auVar212._28_4_ = 0x3e99999a;
          auVar107 = vcmpps_avx(auVar107,auVar212,1);
          local_6a0 = vorps_avx(auVar107,auVar177);
          auVar159._0_4_ = (float)local_820._0_4_ * auVar180._0_4_;
          auVar159._4_4_ = (float)local_820._4_4_ * auVar180._4_4_;
          auVar159._8_4_ = fStack_818 * auVar180._8_4_;
          auVar159._12_4_ = fStack_814 * auVar180._12_4_;
          auVar159._16_4_ = fStack_810 * auVar180._16_4_;
          auVar159._20_4_ = fStack_80c * auVar180._20_4_;
          auVar159._28_36_ = auVar180._28_36_;
          auVar159._24_4_ = fStack_808 * auVar180._24_4_;
          auVar93 = vfmadd213ps_fma(auVar135,_local_800,auVar159._0_32_);
          auVar93 = vfmadd213ps_fma(auVar116,_local_6e0,ZEXT1632(auVar93));
          auVar107 = vandps_avx(local_700,ZEXT1632(auVar93));
          auVar107 = vcmpps_avx(auVar107,auVar212,1);
          auVar107 = vorps_avx(auVar107,auVar177);
          auVar137._8_4_ = 3;
          auVar137._0_8_ = 0x300000003;
          auVar137._12_4_ = 3;
          auVar137._16_4_ = 3;
          auVar137._20_4_ = 3;
          auVar137._24_4_ = 3;
          auVar137._28_4_ = 3;
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar107 = vblendvps_avx(auVar158,auVar137,auVar107);
          local_6c0._4_4_ = local_c24;
          local_6c0._0_4_ = local_c24;
          local_6c0._8_4_ = local_c24;
          local_6c0._12_4_ = local_c24;
          local_6c0._16_4_ = local_c24;
          local_6c0._20_4_ = local_c24;
          local_6c0._24_4_ = local_c24;
          local_6c0._28_4_ = local_c24;
          local_680 = vpcmpgtd_avx2(auVar107,local_6c0);
          auVar107 = vpandn_avx2(local_680,local_660);
          local_840._4_4_ = local_920._4_4_ + (float)local_9a0._4_4_;
          local_840._0_4_ = local_920._0_4_ + (float)local_9a0._0_4_;
          fStack_838 = local_920._8_4_ + fStack_998;
          fStack_834 = local_920._12_4_ + fStack_994;
          fStack_830 = local_920._16_4_ + fStack_990;
          fStack_82c = local_920._20_4_ + fStack_98c;
          fStack_828 = local_920._24_4_ + fStack_988;
          fStack_824 = local_920._28_4_ + fStack_984;
          while( true ) {
            local_460 = auVar107;
            fStack_aec = auVar7._4_4_;
            fStack_ae8 = auVar7._8_4_;
            fStack_ae4 = auVar7._12_4_;
            if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar107 >> 0x7f,0) == '\0') &&
                  (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0xbf,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar107[0x1f]) break;
            auVar138._8_4_ = 0x7f800000;
            auVar138._0_8_ = 0x7f8000007f800000;
            auVar138._12_4_ = 0x7f800000;
            auVar138._16_4_ = 0x7f800000;
            auVar138._20_4_ = 0x7f800000;
            auVar138._24_4_ = 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar118 = vblendvps_avx(auVar138,local_920,auVar107);
            auVar279 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar279 = vminps_avx(auVar118,auVar279);
            auVar12 = vshufpd_avx(auVar279,auVar279,5);
            auVar279 = vminps_avx(auVar279,auVar12);
            auVar12 = vpermpd_avx2(auVar279,0x4e);
            auVar279 = vminps_avx(auVar279,auVar12);
            auVar118 = vcmpps_avx(auVar118,auVar279,0);
            auVar279 = auVar107 & auVar118;
            if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar279 >> 0x7f,0) != '\0') ||
                  (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar279 >> 0xbf,0) != '\0') ||
                (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar279[0x1f] < '\0') {
              auVar107 = vandps_avx(auVar118,auVar107);
            }
            uVar79 = vmovmskps_avx(auVar107);
            iVar15 = 0;
            for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            uVar82 = iVar15 << 2;
            *(undefined4 *)(local_460 + uVar82) = 0;
            uVar79 = *(uint *)(local_1a0 + uVar82);
            uVar82 = *(uint *)(local_440 + uVar82);
            fVar195 = auVar5._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              auVar242 = ZEXT1664(auVar242._0_16_);
              auVar269 = ZEXT1664(auVar269._0_16_);
              fVar195 = sqrtf((float)local_a00._0_4_);
            }
            auVar238 = ZEXT464(uVar82);
            auVar226 = ZEXT464(uVar79);
            auVar92 = vminps_avx(auVar8,auVar10);
            auVar93 = vmaxps_avx(auVar8,auVar10);
            auVar144 = vminps_avx(auVar9,auVar7);
            auVar125 = vminps_avx(auVar92,auVar144);
            auVar92 = vmaxps_avx(auVar9,auVar7);
            auVar144 = vmaxps_avx(auVar93,auVar92);
            auVar93 = vandps_avx(auVar125,auVar240);
            auVar92 = vandps_avx(auVar144,auVar240);
            auVar93 = vmaxps_avx(auVar93,auVar92);
            auVar92 = vmovshdup_avx(auVar93);
            auVar92 = vmaxss_avx(auVar92,auVar93);
            auVar93 = vshufpd_avx(auVar93,auVar93,1);
            auVar93 = vmaxss_avx(auVar93,auVar92);
            local_940._0_4_ = auVar93._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar195 * 1.9073486e-06;
            local_980._0_16_ = vshufps_avx(auVar144,auVar144,0xff);
            auVar93 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar79),0x10);
            auVar180 = ZEXT1664(auVar93);
            lVar81 = 5;
            do {
              do {
                bVar87 = lVar81 == 0;
                lVar81 = lVar81 + -1;
                if (bVar87) goto LAB_0116977f;
                uVar85 = auVar180._0_4_;
                auVar95._4_4_ = uVar85;
                auVar95._0_4_ = uVar85;
                auVar95._8_4_ = uVar85;
                auVar95._12_4_ = uVar85;
                auVar144 = vfmadd213ps_fma(auVar95,local_9f0,_DAT_01f45a50);
                auVar186 = auVar180._0_16_;
                auVar92 = vmovshdup_avx(auVar186);
                fVar217 = auVar92._0_4_;
                fVar216 = 1.0 - fVar217;
                auVar161 = SUB6416(ZEXT464(0x40400000),0);
                auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar125 = vfmadd213ss_fma(auVar161,auVar92,auVar96);
                auVar93 = vfmadd213ss_fma(auVar125,ZEXT416((uint)(fVar217 * fVar217)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar91 = vfmadd213ss_fma(auVar161,ZEXT416((uint)fVar216),auVar96);
                auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar216 * fVar216)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar195 = fVar216 * fVar216 * -fVar217 * 0.5;
                fVar213 = auVar93._0_4_ * 0.5;
                fVar214 = auVar91._0_4_ * 0.5;
                fVar215 = fVar217 * fVar217 * -fVar216 * 0.5;
                auVar162._0_4_ = fVar215 * fVar123;
                auVar162._4_4_ = fVar215 * fStack_aec;
                auVar162._8_4_ = fVar215 * fStack_ae8;
                auVar162._12_4_ = fVar215 * fStack_ae4;
                auVar187._4_4_ = fVar214;
                auVar187._0_4_ = fVar214;
                auVar187._8_4_ = fVar214;
                auVar187._12_4_ = fVar214;
                auVar93 = vfmadd132ps_fma(auVar187,auVar162,auVar9);
                auVar145._4_4_ = fVar213;
                auVar145._0_4_ = fVar213;
                auVar145._8_4_ = fVar213;
                auVar145._12_4_ = fVar213;
                auVar93 = vfmadd132ps_fma(auVar145,auVar93,auVar10);
                auVar163._4_4_ = fVar195;
                auVar163._0_4_ = fVar195;
                auVar163._8_4_ = fVar195;
                auVar163._12_4_ = fVar195;
                local_880 = vfmadd132ps_fma(auVar163,auVar93,auVar8);
                auVar91 = vfmadd231ss_fma(auVar96,auVar92,ZEXT416(0x41100000));
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar92,ZEXT416(0x40800000)
                                         );
                local_a80._0_16_ = auVar93;
                auVar93 = vsubps_avx(auVar144,local_880);
                _local_960 = auVar93;
                auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
                auVar144 = vfmadd213ss_fma(auVar161,auVar92,ZEXT416(0xbf800000));
                fVar195 = auVar93._0_4_;
                if (fVar195 < 0.0) {
                  local_a20._0_16_ = auVar91;
                  local_a40._0_4_ = fVar216 * -2.0;
                  auVar238._0_4_ = sqrtf(fVar195);
                  auVar238._4_60_ = extraout_var;
                  auVar125 = ZEXT416(auVar125._0_4_);
                  auVar180 = ZEXT1664(auVar186);
                  auVar96 = auVar238._0_16_;
                  fVar213 = (float)local_a40._0_4_;
                  auVar91 = local_a20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar93,auVar93);
                  fVar213 = fVar216 * -2.0;
                }
                auVar161 = vfmadd213ss_fma(auVar125,ZEXT416((uint)(fVar217 + fVar217)),
                                           ZEXT416((uint)(fVar217 * fVar217 * 3.0)));
                auVar185 = SUB6416(ZEXT464(0x40000000),0);
                auVar125 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar92,auVar185);
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216 * -3.0)),
                                          ZEXT416((uint)(fVar216 + fVar216)),auVar125);
                auVar124 = vfnmadd231ss_fma(ZEXT416((uint)(fVar217 * (fVar216 + fVar216))),
                                            ZEXT416((uint)fVar216),ZEXT416((uint)fVar216));
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)fVar213),auVar92,
                                           ZEXT416((uint)(fVar217 * fVar217)));
                fVar213 = auVar90._0_4_ * 0.5;
                fVar214 = auVar125._0_4_ * 0.5;
                auVar146._0_4_ = fVar123 * fVar214;
                auVar146._4_4_ = fStack_aec * fVar214;
                auVar146._8_4_ = fStack_ae8 * fVar214;
                auVar146._12_4_ = fStack_ae4 * fVar214;
                auVar126._4_4_ = fVar213;
                auVar126._0_4_ = fVar213;
                auVar126._8_4_ = fVar213;
                auVar126._12_4_ = fVar213;
                auVar125 = vfmadd213ps_fma(auVar126,auVar9,auVar146);
                fVar213 = auVar124._0_4_ * 0.5;
                fVar214 = auVar161._0_4_ * 0.5;
                auVar147._4_4_ = fVar214;
                auVar147._0_4_ = fVar214;
                auVar147._8_4_ = fVar214;
                auVar147._12_4_ = fVar214;
                auVar125 = vfmadd213ps_fma(auVar147,auVar10,auVar125);
                auVar256._4_4_ = fVar213;
                auVar256._0_4_ = fVar213;
                auVar256._8_4_ = fVar213;
                auVar256._12_4_ = fVar213;
                auVar161 = vfmadd213ps_fma(auVar256,auVar8,auVar125);
                auVar125 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0400000),0),auVar185);
                local_b40 = auVar144._0_4_;
                auVar97._0_4_ = fVar123 * local_b40;
                auVar97._4_4_ = fStack_aec * local_b40;
                auVar97._8_4_ = fStack_ae8 * local_b40;
                auVar97._12_4_ = fStack_ae4 * local_b40;
                auVar127._4_4_ = local_a80._0_4_;
                auVar127._0_4_ = local_a80._0_4_;
                auVar127._8_4_ = local_a80._0_4_;
                auVar127._12_4_ = local_a80._0_4_;
                auVar92 = vfmadd213ps_fma(auVar127,auVar9,auVar97);
                uVar85 = auVar91._0_4_;
                auVar148._4_4_ = uVar85;
                auVar148._0_4_ = uVar85;
                auVar148._8_4_ = uVar85;
                auVar148._12_4_ = uVar85;
                auVar92 = vfmadd213ps_fma(auVar148,auVar10,auVar92);
                auVar144 = vdpps_avx(auVar161,auVar161,0x7f);
                uVar85 = auVar125._0_4_;
                auVar128._4_4_ = uVar85;
                auVar128._0_4_ = uVar85;
                auVar128._8_4_ = uVar85;
                auVar128._12_4_ = uVar85;
                auVar91 = vfmadd213ps_fma(auVar128,auVar8,auVar92);
                auVar92 = vblendps_avx(auVar144,_DAT_01f45a50,0xe);
                auVar125 = vrsqrtss_avx(auVar92,auVar92);
                fVar215 = auVar144._0_4_;
                fVar213 = auVar125._0_4_;
                auVar125 = vdpps_avx(auVar161,auVar91,0x7f);
                fVar213 = fVar213 * 1.5 + fVar215 * -0.5 * fVar213 * fVar213 * fVar213;
                auVar129._0_4_ = auVar91._0_4_ * fVar215;
                auVar129._4_4_ = auVar91._4_4_ * fVar215;
                auVar129._8_4_ = auVar91._8_4_ * fVar215;
                auVar129._12_4_ = auVar91._12_4_ * fVar215;
                fVar214 = auVar125._0_4_;
                auVar200._0_4_ = auVar161._0_4_ * fVar214;
                auVar200._4_4_ = auVar161._4_4_ * fVar214;
                fVar216 = auVar161._8_4_;
                auVar200._8_4_ = fVar216 * fVar214;
                fVar217 = auVar161._12_4_;
                auVar200._12_4_ = fVar217 * fVar214;
                auVar125 = vsubps_avx(auVar129,auVar200);
                auVar92 = vrcpss_avx(auVar92,auVar92);
                auVar91 = vfnmadd213ss_fma(auVar92,auVar144,auVar185);
                fVar214 = auVar92._0_4_ * auVar91._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                     ZEXT416((uint)(auVar180._0_4_ * (float)local_7e0._0_4_)));
                auVar242 = ZEXT1664(auVar92);
                auVar235._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = -fVar216;
                auVar235._12_4_ = -fVar217;
                auVar164._0_4_ = fVar213 * auVar125._0_4_ * fVar214;
                auVar164._4_4_ = fVar213 * auVar125._4_4_ * fVar214;
                auVar164._8_4_ = fVar213 * auVar125._8_4_ * fVar214;
                auVar164._12_4_ = fVar213 * auVar125._12_4_ * fVar214;
                auVar248._0_4_ = auVar161._0_4_ * fVar213;
                auVar248._4_4_ = auVar161._4_4_ * fVar213;
                auVar248._8_4_ = fVar216 * fVar213;
                auVar248._12_4_ = fVar217 * fVar213;
                local_a80._0_4_ = auVar92._0_4_;
                if (fVar215 < -fVar215) {
                  fVar213 = sqrtf(fVar215);
                  auVar242 = ZEXT464((uint)local_a80._0_4_);
                  auVar96 = ZEXT416(auVar96._0_4_);
                }
                else {
                  auVar92 = vsqrtss_avx(auVar144,auVar144);
                  fVar213 = auVar92._0_4_;
                }
                auVar92 = vdpps_avx(_local_960,auVar248,0x7f);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar96,auVar242._0_16_);
                auVar144 = vdpps_avx(auVar235,auVar248,0x7f);
                auVar125 = vdpps_avx(_local_960,auVar164,0x7f);
                auVar91 = vdpps_avx(local_9f0,auVar248,0x7f);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar213)),auVar90)
                ;
                fVar213 = auVar144._0_4_ + auVar125._0_4_;
                auVar269 = ZEXT464((uint)fVar213);
                fVar215 = auVar92._0_4_;
                auVar98._0_4_ = fVar215 * fVar215;
                auVar98._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                auVar98._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                auVar98._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                auVar144 = vdpps_avx(_local_960,auVar235,0x7f);
                auVar96 = vsubps_avx(auVar93,auVar98);
                auVar125 = vrsqrtss_avx(auVar96,auVar96);
                fVar216 = auVar96._0_4_;
                fVar214 = auVar125._0_4_;
                fVar214 = fVar214 * 1.5 + fVar216 * -0.5 * fVar214 * fVar214 * fVar214;
                auVar125 = vdpps_avx(_local_960,local_9f0,0x7f);
                auVar144 = vfnmadd231ss_fma(auVar144,auVar92,ZEXT416((uint)fVar213));
                auVar125 = vfnmadd231ss_fma(auVar125,auVar92,auVar91);
                if (fVar216 < 0.0) {
                  local_a20._0_16_ = auVar144;
                  local_a40._0_4_ = fVar214;
                  local_900._0_16_ = auVar125;
                  fVar216 = sqrtf(fVar216);
                  auVar269 = ZEXT1664(ZEXT416((uint)fVar213));
                  auVar242 = ZEXT464((uint)local_a80._0_4_);
                  fVar214 = (float)local_a40._0_4_;
                  auVar125 = local_900._0_16_;
                  auVar144 = local_a20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  fVar216 = auVar96._0_4_;
                }
                auVar226 = ZEXT1664(auVar93);
                auVar238 = ZEXT1664(auVar161);
                auVar96 = vpermilps_avx(local_880,0xff);
                fVar216 = fVar216 - auVar96._0_4_;
                auVar96 = vshufps_avx(auVar161,auVar161,0xff);
                auVar144 = vfmsub213ss_fma(auVar144,ZEXT416((uint)fVar214),auVar96);
                auVar165._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar165._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar165._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar188._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
                auVar188._8_4_ = auVar144._8_4_ ^ 0x80000000;
                auVar188._12_4_ = auVar144._12_4_ ^ 0x80000000;
                auVar124 = ZEXT416((uint)(auVar125._0_4_ * fVar214));
                auVar185 = auVar269._0_16_;
                auVar125 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar144._0_4_)),auVar185,
                                           auVar124);
                auVar144 = vinsertps_avx(auVar188,auVar124,0x1c);
                uVar85 = auVar125._0_4_;
                auVar189._4_4_ = uVar85;
                auVar189._0_4_ = uVar85;
                auVar189._8_4_ = uVar85;
                auVar189._12_4_ = uVar85;
                auVar144 = vdivps_avx(auVar144,auVar189);
                auVar125 = vinsertps_avx(auVar185,auVar165,0x10);
                auVar125 = vdivps_avx(auVar125,auVar189);
                auVar149._0_4_ = fVar215 * auVar144._0_4_ + fVar216 * auVar125._0_4_;
                auVar149._4_4_ = fVar215 * auVar144._4_4_ + fVar216 * auVar125._4_4_;
                auVar149._8_4_ = fVar215 * auVar144._8_4_ + fVar216 * auVar125._8_4_;
                auVar149._12_4_ = fVar215 * auVar144._12_4_ + fVar216 * auVar125._12_4_;
                auVar144 = vsubps_avx(auVar186,auVar149);
                auVar180 = ZEXT1664(auVar144);
                auVar92 = vandps_avx(auVar92,auVar240);
              } while (auVar90._0_4_ <= auVar92._0_4_);
              auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + auVar90._0_4_)),
                                         local_980._0_16_,ZEXT416(0x36000000));
              auVar92 = vandps_avx(ZEXT416((uint)fVar216),auVar240);
            } while (auVar125._0_4_ <= auVar92._0_4_);
            fVar213 = auVar144._0_4_ + (float)local_8d0._0_4_;
            auVar92 = ZEXT416((uint)fVar213);
            if (fVar88 <= fVar213) {
              fVar214 = *(float *)(ray + k * 4 + 0x80);
              auVar242 = ZEXT464((uint)fVar214);
              if (fVar213 <= fVar214) {
                auVar125 = vmovshdup_avx(auVar144);
                fVar215 = auVar125._0_4_;
                if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
                  auVar125 = vrsqrtss_avx(auVar93,auVar93);
                  fVar216 = auVar125._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar80].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    fVar195 = fVar216 * 1.5 + fVar195 * -0.5 * fVar216 * fVar216 * fVar216;
                    auVar166._0_4_ = fVar195 * (float)local_960._0_4_;
                    auVar166._4_4_ = fVar195 * (float)local_960._4_4_;
                    auVar166._8_4_ = fVar195 * fStack_958;
                    auVar166._12_4_ = fVar195 * fStack_954;
                    auVar186 = vfmadd213ps_fma(auVar96,auVar166,auVar161);
                    auVar125 = vshufps_avx(auVar166,auVar166,0xc9);
                    auVar91 = vshufps_avx(auVar161,auVar161,0xc9);
                    auVar167._0_4_ = auVar166._0_4_ * auVar91._0_4_;
                    auVar167._4_4_ = auVar166._4_4_ * auVar91._4_4_;
                    auVar167._8_4_ = auVar166._8_4_ * auVar91._8_4_;
                    auVar167._12_4_ = auVar166._12_4_ * auVar91._12_4_;
                    auVar96 = vfmsub231ps_fma(auVar167,auVar161,auVar125);
                    auVar125 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar91 = vshufps_avx(auVar186,auVar186,0xc9);
                    auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                    auVar99._0_4_ = auVar186._0_4_ * auVar96._0_4_;
                    auVar99._4_4_ = auVar186._4_4_ * auVar96._4_4_;
                    auVar99._8_4_ = auVar186._8_4_ * auVar96._8_4_;
                    auVar99._12_4_ = auVar186._12_4_ * auVar96._12_4_;
                    auVar125 = vfmsub231ps_fma(auVar99,auVar125,auVar91);
                    uVar85 = auVar125._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar213;
                      uVar2 = vextractps_avx(auVar125,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                      uVar2 = vextractps_avx(auVar125,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar85;
                      *(float *)(ray + k * 4 + 0xf0) = fVar215;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                      *(uint *)(ray + k * 4 + 0x120) = uVar80;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_770 = vshufps_avx(auVar144,auVar144,0x55);
                      auVar144 = vshufps_avx(auVar125,auVar125,0x55);
                      auStack_790 = vshufps_avx(auVar125,auVar125,0xaa);
                      local_7a0 = (RTCHitN  [16])auVar144;
                      local_780 = uVar85;
                      uStack_77c = uVar85;
                      uStack_778 = uVar85;
                      uStack_774 = uVar85;
                      local_760 = ZEXT416(0) << 0x20;
                      local_750 = CONCAT44(uStack_7bc,local_7c0);
                      uStack_748 = CONCAT44(uStack_7b4,uStack_7b8);
                      local_740._4_4_ = uStack_7ac;
                      local_740._0_4_ = local_7b0;
                      local_740._8_4_ = uStack_7a8;
                      local_740._12_4_ = uStack_7a4;
                      vpcmpeqd_avx2(ZEXT1632(local_740),ZEXT1632(local_740));
                      uStack_72c = context->user->instID[0];
                      local_730 = uStack_72c;
                      uStack_728 = uStack_72c;
                      uStack_724 = uStack_72c;
                      uStack_720 = context->user->instPrimID[0];
                      uStack_71c = uStack_720;
                      uStack_718 = uStack_720;
                      uStack_714 = uStack_720;
                      *(float *)(ray + k * 4 + 0x80) = fVar213;
                      local_860._0_16_ = *local_a48;
                      local_ab0.valid = (int *)local_860;
                      local_ab0.geometryUserPtr = pGVar3->userPtr;
                      local_ab0.context = context->user;
                      local_ab0.hit = local_7a0;
                      local_ab0.N = 4;
                      auVar125 = *local_a48;
                      local_ab0.ray = (RTCRayN *)ray;
                      if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar226 = ZEXT1664(auVar93);
                        auVar238 = ZEXT1664(auVar161);
                        auVar269 = ZEXT1664(auVar185);
                        (*pGVar3->intersectionFilterN)(&local_ab0);
                        auVar143._8_56_ = extraout_var_01;
                        auVar143._0_8_ = extraout_XMM1_Qa;
                        auVar92 = auVar143._0_16_;
                        auVar125 = local_860._0_16_;
                      }
                      if (auVar125 == (undefined1  [16])0x0) {
                        auVar93 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                        auVar93 = auVar93 ^ auVar92;
                      }
                      else {
                        p_Var4 = context->args->filter;
                        auVar92 = vpcmpeqd_avx(auVar144,auVar144);
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar226 = ZEXT1664(auVar226._0_16_);
                          auVar238 = ZEXT1664(auVar238._0_16_);
                          auVar269 = ZEXT1664(auVar269._0_16_);
                          (*p_Var4)(&local_ab0);
                          auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                          auVar125 = local_860._0_16_;
                        }
                        auVar144 = vpcmpeqd_avx(auVar125,_DAT_01f45a50);
                        auVar93 = auVar144 ^ auVar92;
                        if (auVar125 != (undefined1  [16])0x0) {
                          auVar144 = auVar144 ^ auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])local_ab0.hit);
                          *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x10));
                          *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x20));
                          *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x30));
                          *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x40));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x50));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x60));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x70));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x80));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar92;
                        }
                      }
                      auVar242 = ZEXT464((uint)fVar214);
                      auVar100._8_8_ = 0x100000001;
                      auVar100._0_8_ = 0x100000001;
                      if ((auVar100 & auVar93) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar214;
                      }
                    }
                  }
                }
              }
            }
LAB_0116977f:
            uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar259._4_4_ = uVar85;
            auVar259._0_4_ = uVar85;
            auVar259._8_4_ = uVar85;
            auVar259._12_4_ = uVar85;
            auVar259._16_4_ = uVar85;
            auVar259._20_4_ = uVar85;
            auVar259._24_4_ = uVar85;
            auVar259._28_4_ = uVar85;
            auVar261 = ZEXT3264(auVar259);
            auVar107 = vcmpps_avx(_local_840,auVar259,2);
            auVar107 = vandps_avx(auVar107,local_460);
          }
          auVar120._0_4_ = (float)local_9a0._0_4_ + (float)local_9c0._0_4_;
          auVar120._4_4_ = (float)local_9a0._4_4_ + (float)local_9c0._4_4_;
          auVar120._8_4_ = fStack_998 + fStack_9b8;
          auVar120._12_4_ = fStack_994 + fStack_9b4;
          auVar120._16_4_ = fStack_990 + fStack_9b0;
          auVar120._20_4_ = fStack_98c + fStack_9ac;
          auVar120._24_4_ = fStack_988 + fStack_9a8;
          auVar120._28_4_ = fStack_984 + fStack_9a4;
          uVar85 = auVar261._0_4_;
          auVar139._4_4_ = uVar85;
          auVar139._0_4_ = uVar85;
          auVar139._8_4_ = uVar85;
          auVar139._12_4_ = uVar85;
          auVar139._16_4_ = uVar85;
          auVar139._20_4_ = uVar85;
          auVar139._24_4_ = uVar85;
          auVar139._28_4_ = uVar85;
          auVar107 = vcmpps_avx(auVar120,auVar139,2);
          local_9e0 = vandps_avx(auVar107,local_9e0);
          auVar121._8_4_ = 3;
          auVar121._0_8_ = 0x300000003;
          auVar121._12_4_ = 3;
          auVar121._16_4_ = 3;
          auVar121._20_4_ = 3;
          auVar121._24_4_ = 3;
          auVar121._28_4_ = 3;
          auVar140._8_4_ = 2;
          auVar140._0_8_ = 0x200000002;
          auVar140._12_4_ = 2;
          auVar140._16_4_ = 2;
          auVar140._20_4_ = 2;
          auVar140._24_4_ = 2;
          auVar140._28_4_ = 2;
          auVar107 = vblendvps_avx(auVar140,auVar121,local_6a0);
          _local_840 = vpcmpgtd_avx2(auVar107,local_6c0);
          local_860 = vpandn_avx2(_local_840,local_9e0);
          local_920 = _local_400;
          local_9c0._4_4_ = (float)local_9a0._4_4_ + (float)local_400._4_4_;
          local_9c0._0_4_ = (float)local_9a0._0_4_ + (float)local_400._0_4_;
          fStack_9b8 = fStack_998 + fStack_3f8;
          fStack_9b4 = fStack_994 + fStack_3f4;
          fStack_9b0 = fStack_990 + fStack_3f0;
          fStack_9ac = fStack_98c + fStack_3ec;
          fStack_9a8 = fStack_988 + fStack_3e8;
          fStack_9a4 = fStack_984 + fStack_3e4;
          while( true ) {
            if ((((((((local_860 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_860 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_860 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_860 >> 0x7f,0) == '\0') &&
                  (local_860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_860 >> 0xbf,0) == '\0') &&
                (local_860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_860[0x1f]) break;
            auVar141._8_4_ = 0x7f800000;
            auVar141._0_8_ = 0x7f8000007f800000;
            auVar141._12_4_ = 0x7f800000;
            auVar141._16_4_ = 0x7f800000;
            auVar141._20_4_ = 0x7f800000;
            auVar141._24_4_ = 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar141,local_920,local_860);
            auVar118 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar118 = vminps_avx(auVar107,auVar118);
            auVar279 = vshufpd_avx(auVar118,auVar118,5);
            auVar118 = vminps_avx(auVar118,auVar279);
            auVar279 = vpermpd_avx2(auVar118,0x4e);
            auVar118 = vminps_avx(auVar118,auVar279);
            auVar118 = vcmpps_avx(auVar107,auVar118,0);
            auVar279 = local_860 & auVar118;
            auVar107 = local_860;
            if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar279 >> 0x7f,0) != '\0') ||
                  (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar279 >> 0xbf,0) != '\0') ||
                (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar279[0x1f] < '\0') {
              auVar107 = vandps_avx(auVar118,local_860);
            }
            uVar79 = vmovmskps_avx(auVar107);
            iVar15 = 0;
            for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            uVar82 = iVar15 << 2;
            *(undefined4 *)(local_860 + uVar82) = 0;
            uVar79 = *(uint *)(local_1c0 + uVar82);
            uVar82 = *(uint *)(local_3e0 + uVar82);
            fVar195 = auVar6._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              auVar242 = ZEXT1664(auVar242._0_16_);
              auVar269 = ZEXT1664(auVar269._0_16_);
              fVar195 = sqrtf((float)local_a00._0_4_);
            }
            auVar238 = ZEXT464(uVar82);
            auVar226 = ZEXT464(uVar79);
            auVar92 = vminps_avx(auVar8,auVar10);
            auVar93 = vmaxps_avx(auVar8,auVar10);
            auVar144 = vminps_avx(auVar9,auVar7);
            auVar125 = vminps_avx(auVar92,auVar144);
            auVar92 = vmaxps_avx(auVar9,auVar7);
            auVar144 = vmaxps_avx(auVar93,auVar92);
            auVar93 = vandps_avx(auVar125,auVar240);
            auVar92 = vandps_avx(auVar144,auVar240);
            auVar93 = vmaxps_avx(auVar93,auVar92);
            auVar92 = vmovshdup_avx(auVar93);
            auVar92 = vmaxss_avx(auVar92,auVar93);
            auVar93 = vshufpd_avx(auVar93,auVar93,1);
            auVar93 = vmaxss_avx(auVar93,auVar92);
            local_940._0_4_ = auVar93._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar195 * 1.9073486e-06;
            local_980._0_16_ = vshufps_avx(auVar144,auVar144,0xff);
            auVar93 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar79),0x10);
            auVar180 = ZEXT1664(auVar93);
            lVar81 = 5;
            do {
              do {
                bVar87 = lVar81 == 0;
                lVar81 = lVar81 + -1;
                if (bVar87) goto LAB_0116a32e;
                uVar85 = auVar180._0_4_;
                auVar101._4_4_ = uVar85;
                auVar101._0_4_ = uVar85;
                auVar101._8_4_ = uVar85;
                auVar101._12_4_ = uVar85;
                auVar144 = vfmadd213ps_fma(auVar101,local_9f0,_DAT_01f45a50);
                auVar186 = auVar180._0_16_;
                auVar92 = vmovshdup_avx(auVar186);
                fVar217 = auVar92._0_4_;
                fVar216 = 1.0 - fVar217;
                auVar161 = SUB6416(ZEXT464(0x40400000),0);
                auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar125 = vfmadd213ss_fma(auVar161,auVar92,auVar96);
                auVar93 = vfmadd213ss_fma(auVar125,ZEXT416((uint)(fVar217 * fVar217)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar91 = vfmadd213ss_fma(auVar161,ZEXT416((uint)fVar216),auVar96);
                auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar216 * fVar216)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar195 = fVar216 * fVar216 * -fVar217 * 0.5;
                fVar213 = auVar93._0_4_ * 0.5;
                fVar214 = auVar91._0_4_ * 0.5;
                fVar215 = fVar217 * fVar217 * -fVar216 * 0.5;
                auVar168._0_4_ = fVar215 * fVar123;
                auVar168._4_4_ = fVar215 * fStack_aec;
                auVar168._8_4_ = fVar215 * fStack_ae8;
                auVar168._12_4_ = fVar215 * fStack_ae4;
                auVar190._4_4_ = fVar214;
                auVar190._0_4_ = fVar214;
                auVar190._8_4_ = fVar214;
                auVar190._12_4_ = fVar214;
                auVar93 = vfmadd132ps_fma(auVar190,auVar168,auVar9);
                auVar150._4_4_ = fVar213;
                auVar150._0_4_ = fVar213;
                auVar150._8_4_ = fVar213;
                auVar150._12_4_ = fVar213;
                auVar93 = vfmadd132ps_fma(auVar150,auVar93,auVar10);
                auVar169._4_4_ = fVar195;
                auVar169._0_4_ = fVar195;
                auVar169._8_4_ = fVar195;
                auVar169._12_4_ = fVar195;
                local_880 = vfmadd132ps_fma(auVar169,auVar93,auVar8);
                auVar91 = vfmadd231ss_fma(auVar96,auVar92,ZEXT416(0x41100000));
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar92,ZEXT416(0x40800000)
                                         );
                local_a80._0_16_ = auVar93;
                auVar93 = vsubps_avx(auVar144,local_880);
                _local_960 = auVar93;
                auVar93 = vdpps_avx(auVar93,auVar93,0x7f);
                auVar144 = vfmadd213ss_fma(auVar161,auVar92,ZEXT416(0xbf800000));
                fVar195 = auVar93._0_4_;
                if (fVar195 < 0.0) {
                  local_a20._0_16_ = auVar91;
                  local_a40._0_4_ = fVar216 * -2.0;
                  auVar226._0_4_ = sqrtf(fVar195);
                  auVar226._4_60_ = extraout_var_00;
                  auVar125 = ZEXT416(auVar125._0_4_);
                  auVar180 = ZEXT1664(auVar186);
                  auVar96 = auVar226._0_16_;
                  fVar213 = (float)local_a40._0_4_;
                  auVar91 = local_a20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar93,auVar93);
                  fVar213 = fVar216 * -2.0;
                }
                auVar161 = vfmadd213ss_fma(auVar125,ZEXT416((uint)(fVar217 + fVar217)),
                                           ZEXT416((uint)(fVar217 * fVar217 * 3.0)));
                auVar185 = SUB6416(ZEXT464(0x40000000),0);
                auVar125 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar92,auVar185);
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216 * -3.0)),
                                          ZEXT416((uint)(fVar216 + fVar216)),auVar125);
                auVar124 = vfnmadd231ss_fma(ZEXT416((uint)(fVar217 * (fVar216 + fVar216))),
                                            ZEXT416((uint)fVar216),ZEXT416((uint)fVar216));
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)fVar213),auVar92,
                                           ZEXT416((uint)(fVar217 * fVar217)));
                fVar213 = auVar90._0_4_ * 0.5;
                fVar214 = auVar125._0_4_ * 0.5;
                auVar151._0_4_ = fVar123 * fVar214;
                auVar151._4_4_ = fStack_aec * fVar214;
                auVar151._8_4_ = fStack_ae8 * fVar214;
                auVar151._12_4_ = fStack_ae4 * fVar214;
                auVar130._4_4_ = fVar213;
                auVar130._0_4_ = fVar213;
                auVar130._8_4_ = fVar213;
                auVar130._12_4_ = fVar213;
                auVar125 = vfmadd213ps_fma(auVar130,auVar9,auVar151);
                fVar213 = auVar124._0_4_ * 0.5;
                fVar214 = auVar161._0_4_ * 0.5;
                auVar152._4_4_ = fVar214;
                auVar152._0_4_ = fVar214;
                auVar152._8_4_ = fVar214;
                auVar152._12_4_ = fVar214;
                auVar125 = vfmadd213ps_fma(auVar152,auVar10,auVar125);
                auVar257._4_4_ = fVar213;
                auVar257._0_4_ = fVar213;
                auVar257._8_4_ = fVar213;
                auVar257._12_4_ = fVar213;
                auVar161 = vfmadd213ps_fma(auVar257,auVar8,auVar125);
                auVar125 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0400000),0),auVar185);
                local_b40 = auVar144._0_4_;
                auVar102._0_4_ = fVar123 * local_b40;
                auVar102._4_4_ = fStack_aec * local_b40;
                auVar102._8_4_ = fStack_ae8 * local_b40;
                auVar102._12_4_ = fStack_ae4 * local_b40;
                auVar131._4_4_ = local_a80._0_4_;
                auVar131._0_4_ = local_a80._0_4_;
                auVar131._8_4_ = local_a80._0_4_;
                auVar131._12_4_ = local_a80._0_4_;
                auVar92 = vfmadd213ps_fma(auVar131,auVar9,auVar102);
                uVar85 = auVar91._0_4_;
                auVar153._4_4_ = uVar85;
                auVar153._0_4_ = uVar85;
                auVar153._8_4_ = uVar85;
                auVar153._12_4_ = uVar85;
                auVar92 = vfmadd213ps_fma(auVar153,auVar10,auVar92);
                auVar144 = vdpps_avx(auVar161,auVar161,0x7f);
                uVar85 = auVar125._0_4_;
                auVar132._4_4_ = uVar85;
                auVar132._0_4_ = uVar85;
                auVar132._8_4_ = uVar85;
                auVar132._12_4_ = uVar85;
                auVar91 = vfmadd213ps_fma(auVar132,auVar8,auVar92);
                auVar92 = vblendps_avx(auVar144,_DAT_01f45a50,0xe);
                auVar125 = vrsqrtss_avx(auVar92,auVar92);
                fVar215 = auVar144._0_4_;
                fVar213 = auVar125._0_4_;
                auVar125 = vdpps_avx(auVar161,auVar91,0x7f);
                fVar213 = fVar213 * 1.5 + fVar215 * -0.5 * fVar213 * fVar213 * fVar213;
                auVar133._0_4_ = auVar91._0_4_ * fVar215;
                auVar133._4_4_ = auVar91._4_4_ * fVar215;
                auVar133._8_4_ = auVar91._8_4_ * fVar215;
                auVar133._12_4_ = auVar91._12_4_ * fVar215;
                fVar214 = auVar125._0_4_;
                auVar201._0_4_ = auVar161._0_4_ * fVar214;
                auVar201._4_4_ = auVar161._4_4_ * fVar214;
                fVar216 = auVar161._8_4_;
                auVar201._8_4_ = fVar216 * fVar214;
                fVar217 = auVar161._12_4_;
                auVar201._12_4_ = fVar217 * fVar214;
                auVar125 = vsubps_avx(auVar133,auVar201);
                auVar92 = vrcpss_avx(auVar92,auVar92);
                auVar91 = vfnmadd213ss_fma(auVar92,auVar144,auVar185);
                fVar214 = auVar92._0_4_ * auVar91._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                     ZEXT416((uint)(auVar180._0_4_ * (float)local_7e0._0_4_)));
                auVar242 = ZEXT1664(auVar92);
                auVar236._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = -fVar216;
                auVar236._12_4_ = -fVar217;
                auVar170._0_4_ = fVar213 * auVar125._0_4_ * fVar214;
                auVar170._4_4_ = fVar213 * auVar125._4_4_ * fVar214;
                auVar170._8_4_ = fVar213 * auVar125._8_4_ * fVar214;
                auVar170._12_4_ = fVar213 * auVar125._12_4_ * fVar214;
                auVar249._0_4_ = auVar161._0_4_ * fVar213;
                auVar249._4_4_ = auVar161._4_4_ * fVar213;
                auVar249._8_4_ = fVar216 * fVar213;
                auVar249._12_4_ = fVar217 * fVar213;
                local_a80._0_4_ = auVar92._0_4_;
                if (fVar215 < -fVar215) {
                  fVar213 = sqrtf(fVar215);
                  auVar242 = ZEXT464((uint)local_a80._0_4_);
                  auVar96 = ZEXT416(auVar96._0_4_);
                }
                else {
                  auVar92 = vsqrtss_avx(auVar144,auVar144);
                  fVar213 = auVar92._0_4_;
                }
                auVar92 = vdpps_avx(_local_960,auVar249,0x7f);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar96,auVar242._0_16_);
                auVar144 = vdpps_avx(auVar236,auVar249,0x7f);
                auVar125 = vdpps_avx(_local_960,auVar170,0x7f);
                auVar91 = vdpps_avx(local_9f0,auVar249,0x7f);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar213)),auVar90)
                ;
                fVar213 = auVar144._0_4_ + auVar125._0_4_;
                auVar269 = ZEXT464((uint)fVar213);
                fVar215 = auVar92._0_4_;
                auVar103._0_4_ = fVar215 * fVar215;
                auVar103._4_4_ = auVar92._4_4_ * auVar92._4_4_;
                auVar103._8_4_ = auVar92._8_4_ * auVar92._8_4_;
                auVar103._12_4_ = auVar92._12_4_ * auVar92._12_4_;
                auVar144 = vdpps_avx(_local_960,auVar236,0x7f);
                auVar96 = vsubps_avx(auVar93,auVar103);
                auVar125 = vrsqrtss_avx(auVar96,auVar96);
                fVar216 = auVar96._0_4_;
                fVar214 = auVar125._0_4_;
                fVar214 = fVar214 * 1.5 + fVar216 * -0.5 * fVar214 * fVar214 * fVar214;
                auVar125 = vdpps_avx(_local_960,local_9f0,0x7f);
                auVar144 = vfnmadd231ss_fma(auVar144,auVar92,ZEXT416((uint)fVar213));
                auVar125 = vfnmadd231ss_fma(auVar125,auVar92,auVar91);
                if (fVar216 < 0.0) {
                  local_a20._0_16_ = auVar144;
                  local_a40._0_4_ = fVar214;
                  local_900._0_16_ = auVar125;
                  fVar216 = sqrtf(fVar216);
                  auVar269 = ZEXT1664(ZEXT416((uint)fVar213));
                  auVar242 = ZEXT464((uint)local_a80._0_4_);
                  fVar214 = (float)local_a40._0_4_;
                  auVar125 = local_900._0_16_;
                  auVar144 = local_a20._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  fVar216 = auVar96._0_4_;
                }
                auVar226 = ZEXT1664(auVar93);
                auVar238 = ZEXT1664(auVar161);
                auVar96 = vpermilps_avx(local_880,0xff);
                fVar216 = fVar216 - auVar96._0_4_;
                auVar96 = vshufps_avx(auVar161,auVar161,0xff);
                auVar144 = vfmsub213ss_fma(auVar144,ZEXT416((uint)fVar214),auVar96);
                auVar171._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar171._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar171._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar191._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar144._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar144._12_4_ ^ 0x80000000;
                auVar124 = ZEXT416((uint)(auVar125._0_4_ * fVar214));
                auVar185 = auVar269._0_16_;
                auVar125 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar144._0_4_)),auVar185,
                                           auVar124);
                auVar144 = vinsertps_avx(auVar191,auVar124,0x1c);
                uVar85 = auVar125._0_4_;
                auVar192._4_4_ = uVar85;
                auVar192._0_4_ = uVar85;
                auVar192._8_4_ = uVar85;
                auVar192._12_4_ = uVar85;
                auVar144 = vdivps_avx(auVar144,auVar192);
                auVar125 = vinsertps_avx(auVar185,auVar171,0x10);
                auVar125 = vdivps_avx(auVar125,auVar192);
                auVar154._0_4_ = fVar215 * auVar144._0_4_ + fVar216 * auVar125._0_4_;
                auVar154._4_4_ = fVar215 * auVar144._4_4_ + fVar216 * auVar125._4_4_;
                auVar154._8_4_ = fVar215 * auVar144._8_4_ + fVar216 * auVar125._8_4_;
                auVar154._12_4_ = fVar215 * auVar144._12_4_ + fVar216 * auVar125._12_4_;
                auVar144 = vsubps_avx(auVar186,auVar154);
                auVar180 = ZEXT1664(auVar144);
                auVar92 = vandps_avx(auVar92,auVar240);
              } while (auVar90._0_4_ <= auVar92._0_4_);
              auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + auVar90._0_4_)),
                                         local_980._0_16_,ZEXT416(0x36000000));
              auVar92 = vandps_avx(ZEXT416((uint)fVar216),auVar240);
            } while (auVar125._0_4_ <= auVar92._0_4_);
            fVar213 = auVar144._0_4_ + (float)local_8d0._0_4_;
            auVar92 = ZEXT416((uint)fVar213);
            if (fVar88 <= fVar213) {
              fVar214 = *(float *)(ray + k * 4 + 0x80);
              auVar242 = ZEXT464((uint)fVar214);
              if (fVar213 <= fVar214) {
                auVar125 = vmovshdup_avx(auVar144);
                fVar215 = auVar125._0_4_;
                if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
                  auVar125 = vrsqrtss_avx(auVar93,auVar93);
                  fVar216 = auVar125._0_4_;
                  pGVar3 = (context->scene->geometries).items[uVar80].ptr;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    fVar195 = fVar216 * 1.5 + fVar195 * -0.5 * fVar216 * fVar216 * fVar216;
                    auVar172._0_4_ = fVar195 * (float)local_960._0_4_;
                    auVar172._4_4_ = fVar195 * (float)local_960._4_4_;
                    auVar172._8_4_ = fVar195 * fStack_958;
                    auVar172._12_4_ = fVar195 * fStack_954;
                    auVar186 = vfmadd213ps_fma(auVar96,auVar172,auVar161);
                    auVar125 = vshufps_avx(auVar172,auVar172,0xc9);
                    auVar91 = vshufps_avx(auVar161,auVar161,0xc9);
                    auVar173._0_4_ = auVar172._0_4_ * auVar91._0_4_;
                    auVar173._4_4_ = auVar172._4_4_ * auVar91._4_4_;
                    auVar173._8_4_ = auVar172._8_4_ * auVar91._8_4_;
                    auVar173._12_4_ = auVar172._12_4_ * auVar91._12_4_;
                    auVar96 = vfmsub231ps_fma(auVar173,auVar161,auVar125);
                    auVar125 = vshufps_avx(auVar96,auVar96,0xc9);
                    auVar91 = vshufps_avx(auVar186,auVar186,0xc9);
                    auVar96 = vshufps_avx(auVar96,auVar96,0xd2);
                    auVar104._0_4_ = auVar186._0_4_ * auVar96._0_4_;
                    auVar104._4_4_ = auVar186._4_4_ * auVar96._4_4_;
                    auVar104._8_4_ = auVar186._8_4_ * auVar96._8_4_;
                    auVar104._12_4_ = auVar186._12_4_ * auVar96._12_4_;
                    auVar125 = vfmsub231ps_fma(auVar104,auVar125,auVar91);
                    uVar85 = auVar125._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar213;
                      uVar2 = vextractps_avx(auVar125,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                      uVar2 = vextractps_avx(auVar125,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar85;
                      *(float *)(ray + k * 4 + 0xf0) = fVar215;
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_8a0;
                      *(uint *)(ray + k * 4 + 0x120) = uVar80;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_770 = vshufps_avx(auVar144,auVar144,0x55);
                      auVar144 = vshufps_avx(auVar125,auVar125,0x55);
                      auStack_790 = vshufps_avx(auVar125,auVar125,0xaa);
                      local_7a0 = (RTCHitN  [16])auVar144;
                      local_780 = uVar85;
                      uStack_77c = uVar85;
                      uStack_778 = uVar85;
                      uStack_774 = uVar85;
                      local_760 = ZEXT416(0) << 0x20;
                      local_750 = CONCAT44(uStack_7bc,local_7c0);
                      uStack_748 = CONCAT44(uStack_7b4,uStack_7b8);
                      local_740._4_4_ = uStack_7ac;
                      local_740._0_4_ = local_7b0;
                      local_740._8_4_ = uStack_7a8;
                      local_740._12_4_ = uStack_7a4;
                      vpcmpeqd_avx2(ZEXT1632(local_740),ZEXT1632(local_740));
                      uStack_72c = context->user->instID[0];
                      local_730 = uStack_72c;
                      uStack_728 = uStack_72c;
                      uStack_724 = uStack_72c;
                      uStack_720 = context->user->instPrimID[0];
                      uStack_71c = uStack_720;
                      uStack_718 = uStack_720;
                      uStack_714 = uStack_720;
                      *(float *)(ray + k * 4 + 0x80) = fVar213;
                      local_8c0 = *local_a48;
                      local_ab0.valid = (int *)local_8c0;
                      local_ab0.geometryUserPtr = pGVar3->userPtr;
                      local_ab0.context = context->user;
                      local_ab0.hit = local_7a0;
                      local_ab0.N = 4;
                      local_ab0.ray = (RTCRayN *)ray;
                      if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar226 = ZEXT1664(auVar93);
                        auVar238 = ZEXT1664(auVar161);
                        auVar269 = ZEXT1664(auVar185);
                        (*pGVar3->intersectionFilterN)(&local_ab0);
                        auVar242._8_56_ = extraout_var_02;
                        auVar242._0_8_ = extraout_XMM1_Qa_00;
                        auVar92 = auVar242._0_16_;
                      }
                      if (local_8c0 == (undefined1  [16])0x0) {
                        auVar93 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                        auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                        auVar93 = auVar93 ^ auVar92;
                      }
                      else {
                        p_Var4 = context->args->filter;
                        auVar92 = vpcmpeqd_avx(auVar144,auVar144);
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar226 = ZEXT1664(auVar226._0_16_);
                          auVar238 = ZEXT1664(auVar238._0_16_);
                          auVar269 = ZEXT1664(auVar269._0_16_);
                          (*p_Var4)(&local_ab0);
                          auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                        }
                        auVar144 = vpcmpeqd_avx(local_8c0,_DAT_01f45a50);
                        auVar93 = auVar144 ^ auVar92;
                        if (local_8c0 != (undefined1  [16])0x0) {
                          auVar144 = auVar144 ^ auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])local_ab0.hit);
                          *(undefined1 (*) [16])(local_ab0.ray + 0xc0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x10));
                          *(undefined1 (*) [16])(local_ab0.ray + 0xd0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x20));
                          *(undefined1 (*) [16])(local_ab0.ray + 0xe0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x30));
                          *(undefined1 (*) [16])(local_ab0.ray + 0xf0) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x40));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x100) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x50));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x110) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x60));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x120) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x70));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x130) = auVar92;
                          auVar92 = vmaskmovps_avx(auVar144,*(undefined1 (*) [16])
                                                             (local_ab0.hit + 0x80));
                          *(undefined1 (*) [16])(local_ab0.ray + 0x140) = auVar92;
                        }
                      }
                      auVar242 = ZEXT464((uint)fVar214);
                      auVar105._8_8_ = 0x100000001;
                      auVar105._0_8_ = 0x100000001;
                      if ((auVar105 & auVar93) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar214;
                      }
                    }
                  }
                }
              }
            }
LAB_0116a32e:
            uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar260._4_4_ = uVar85;
            auVar260._0_4_ = uVar85;
            auVar260._8_4_ = uVar85;
            auVar260._12_4_ = uVar85;
            auVar260._16_4_ = uVar85;
            auVar260._20_4_ = uVar85;
            auVar260._24_4_ = uVar85;
            auVar260._28_4_ = uVar85;
            auVar261 = ZEXT3264(auVar260);
            auVar107 = vcmpps_avx(_local_9c0,auVar260,2);
            local_860 = vandps_avx(auVar107,local_860);
          }
          auVar142._0_4_ = (float)local_9a0._0_4_ + local_440._0_4_;
          auVar142._4_4_ = (float)local_9a0._4_4_ + local_440._4_4_;
          auVar142._8_4_ = fStack_998 + local_440._8_4_;
          auVar142._12_4_ = fStack_994 + local_440._12_4_;
          auVar142._16_4_ = fStack_990 + local_440._16_4_;
          auVar142._20_4_ = fStack_98c + local_440._20_4_;
          auVar142._24_4_ = fStack_988 + local_440._24_4_;
          auVar142._28_4_ = fStack_984 + local_440._28_4_;
          uVar85 = auVar261._0_4_;
          auVar178._4_4_ = uVar85;
          auVar178._0_4_ = uVar85;
          auVar178._8_4_ = uVar85;
          auVar178._12_4_ = uVar85;
          auVar178._16_4_ = uVar85;
          auVar178._20_4_ = uVar85;
          auVar178._24_4_ = uVar85;
          auVar178._28_4_ = uVar85;
          auVar118 = vcmpps_avx(auVar142,auVar178,2);
          auVar107 = vandps_avx(local_680,local_660);
          auVar107 = vandps_avx(auVar118,auVar107);
          auVar193._0_4_ = (float)local_9a0._0_4_ + local_400._0_4_;
          auVar193._4_4_ = (float)local_9a0._4_4_ + local_400._4_4_;
          auVar193._8_4_ = fStack_998 + local_400._8_4_;
          auVar193._12_4_ = fStack_994 + local_400._12_4_;
          auVar193._16_4_ = fStack_990 + local_400._16_4_;
          auVar193._20_4_ = fStack_98c + local_400._20_4_;
          auVar193._24_4_ = fStack_988 + local_400._24_4_;
          auVar193._28_4_ = fStack_984 + local_400._28_4_;
          auVar279 = vcmpps_avx(auVar193,auVar178,2);
          auVar118 = vandps_avx(_local_840,local_9e0);
          auVar118 = vandps_avx(auVar279,auVar118);
          auVar118 = vorps_avx(auVar107,auVar118);
          fVar195 = (float)local_9a0._0_4_;
          fVar214 = (float)local_9a0._4_4_;
          fVar216 = fStack_998;
          fVar218 = fStack_994;
          fVar182 = fStack_990;
          fVar183 = fStack_98c;
          fVar184 = fStack_988;
          fVar232 = fStack_984;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0x7f,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0xbf,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar118[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x60) = auVar118;
            auVar107 = vblendvps_avx(_local_400,local_440,auVar107);
            *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar107;
            uVar16 = vmovlps_avx(local_630);
            (&uStack_140)[uVar83 * 0xc] = uVar16;
            aiStack_138[uVar83 * 0x18] = local_c24 + 1;
            uVar83 = (ulong)((int)uVar83 + 1);
          }
          goto LAB_01168cde;
        }
      }
      auVar242 = ZEXT3264(auVar107);
    }
LAB_01168cde:
    while( true ) {
      uVar79 = (uint)uVar83;
      if (uVar79 == 0) {
        uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar106._4_4_ = uVar85;
        auVar106._0_4_ = uVar85;
        auVar106._8_4_ = uVar85;
        auVar106._12_4_ = uVar85;
        auVar5 = vcmpps_avx(local_640,auVar106,2);
        uVar80 = vmovmskps_avx(auVar5);
        uVar86 = (ulong)((uint)uVar86 & uVar80);
        goto LAB_01167d3c;
      }
      uVar83 = (ulong)(uVar79 - 1);
      lVar81 = uVar83 * 0x60;
      auVar107 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar117._0_4_ = fVar195 + auVar107._0_4_;
      auVar117._4_4_ = fVar214 + auVar107._4_4_;
      auVar117._8_4_ = fVar216 + auVar107._8_4_;
      auVar117._12_4_ = fVar218 + auVar107._12_4_;
      auVar117._16_4_ = fVar182 + auVar107._16_4_;
      auVar117._20_4_ = fVar183 + auVar107._20_4_;
      auVar117._24_4_ = fVar184 + auVar107._24_4_;
      auVar117._28_4_ = fVar232 + auVar107._28_4_;
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar176._4_4_ = uVar85;
      auVar176._0_4_ = uVar85;
      auVar176._8_4_ = uVar85;
      auVar176._12_4_ = uVar85;
      auVar176._16_4_ = uVar85;
      auVar176._20_4_ = uVar85;
      auVar176._24_4_ = uVar85;
      auVar176._28_4_ = uVar85;
      auVar279 = vcmpps_avx(auVar117,auVar176,2);
      auVar118 = vandps_avx(auVar279,*(undefined1 (*) [32])(auStack_180 + lVar81));
      _local_7a0 = auVar118;
      auVar279 = *(undefined1 (*) [32])(auStack_180 + lVar81) & auVar279;
      if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar279 >> 0x7f,0) != '\0') ||
            (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar279 >> 0xbf,0) != '\0') ||
          (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar279[0x1f] < '\0') break;
      uVar83 = (ulong)(uVar79 - 1);
    }
    auVar157._8_4_ = 0x7f800000;
    auVar157._0_8_ = 0x7f8000007f800000;
    auVar157._12_4_ = 0x7f800000;
    auVar157._16_4_ = 0x7f800000;
    auVar157._20_4_ = 0x7f800000;
    auVar157._24_4_ = 0x7f800000;
    auVar157._28_4_ = 0x7f800000;
    auVar107 = vblendvps_avx(auVar157,auVar107,auVar118);
    auVar279 = vshufps_avx(auVar107,auVar107,0xb1);
    auVar279 = vminps_avx(auVar107,auVar279);
    auVar12 = vshufpd_avx(auVar279,auVar279,5);
    auVar279 = vminps_avx(auVar279,auVar12);
    auVar12 = vpermpd_avx2(auVar279,0x4e);
    auVar180 = ZEXT3264(auVar12);
    auVar279 = vminps_avx(auVar279,auVar12);
    auVar107 = vcmpps_avx(auVar107,auVar279,0);
    auVar279 = auVar118 & auVar107;
    if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar279 >> 0x7f,0) != '\0') ||
          (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar279 >> 0xbf,0) != '\0') ||
        (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar279[0x1f] < '\0') {
      auVar118 = vandps_avx(auVar107,auVar118);
    }
    uVar82 = vmovmskps_avx(auVar118);
    iVar15 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      iVar15 = iVar15 + 1;
    }
    *(undefined4 *)(local_7a0 + (uint)(iVar15 << 2)) = 0;
    uVar16 = (&uStack_140)[uVar83 * 0xc];
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar16;
    local_c24 = aiStack_138[uVar83 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar81) = _local_7a0;
    uVar82 = uVar79 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar82 = uVar79;
    }
    uVar85 = (undefined4)uVar16;
    auVar136._4_4_ = uVar85;
    auVar136._0_4_ = uVar85;
    auVar136._8_4_ = uVar85;
    auVar136._12_4_ = uVar85;
    auVar136._16_4_ = uVar85;
    auVar136._20_4_ = uVar85;
    auVar136._24_4_ = uVar85;
    auVar136._28_4_ = uVar85;
    auVar93 = vmovshdup_avx(auVar94);
    auVar93 = vsubps_avx(auVar93,auVar94);
    auVar119._0_4_ = auVar93._0_4_;
    auVar119._4_4_ = auVar119._0_4_;
    auVar119._8_4_ = auVar119._0_4_;
    auVar119._12_4_ = auVar119._0_4_;
    auVar119._16_4_ = auVar119._0_4_;
    auVar119._20_4_ = auVar119._0_4_;
    auVar119._24_4_ = auVar119._0_4_;
    auVar119._28_4_ = auVar119._0_4_;
    auVar93 = vfmadd132ps_fma(auVar119,auVar136,_DAT_01f7b040);
    local_440 = ZEXT1632(auVar93);
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_440 + (uint)(iVar15 << 2));
    uVar83 = (ulong)uVar82;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }